

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,
               uint8_t *blimit1,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  uint16_t uVar51;
  uint16_t uVar52;
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  uint16_t uVar73;
  uint16_t uVar74;
  uint16_t uVar75;
  uint16_t uVar76;
  uint16_t uVar77;
  uint16_t uVar78;
  uint16_t uVar79;
  uint16_t uVar80;
  uint16_t uVar81;
  uint16_t uVar82;
  uint16_t uVar83;
  uint16_t uVar84;
  uint16_t uVar85;
  uint16_t uVar86;
  uint16_t uVar87;
  uint16_t uVar88;
  uint16_t uVar89;
  uint16_t uVar90;
  uint16_t uVar91;
  uint16_t uVar92;
  uint16_t uVar93;
  uint16_t uVar94;
  uint16_t uVar95;
  uint16_t uVar96;
  uint16_t uVar97;
  uint16_t uVar98;
  uint16_t uVar99;
  uint16_t uVar100;
  uint16_t uVar101;
  uint16_t uVar102;
  uint16_t uVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [12];
  undefined1 auVar108 [16];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [12];
  undefined1 auVar124 [12];
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  undefined1 auVar127 [12];
  undefined1 auVar128 [12];
  undefined1 auVar129 [12];
  undefined1 auVar130 [12];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [16];
  undefined1 auVar144 [12];
  unkbyte10 Var145;
  unkbyte10 Var146;
  bool bVar147;
  long lVar148;
  undefined1 (*pauVar149) [16];
  undefined1 (*pauVar150) [16];
  long lVar151;
  undefined1 (*pauVar152) [16];
  long lVar153;
  undefined1 (*pauVar154) [16];
  bool bVar155;
  undefined1 (*pauVar156) [16];
  long lVar157;
  undefined1 (*pauVar158) [16];
  long lVar159;
  long lVar160;
  long lVar161;
  short sVar162;
  short sVar163;
  undefined4 uVar164;
  undefined4 uVar165;
  short sVar180;
  short sVar182;
  short sVar186;
  undefined1 auVar166 [12];
  undefined1 auVar167 [12];
  short sVar192;
  short sVar193;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  short sVar178;
  short sVar179;
  short sVar181;
  short sVar183;
  short sVar187;
  short sVar190;
  short sVar191;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar197;
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  short sVar198;
  short sVar208;
  short sVar209;
  short sVar210;
  short sVar213;
  undefined1 auVar199 [12];
  short sVar216;
  undefined1 auVar201 [12];
  short sVar217;
  undefined1 auVar203 [16];
  undefined1 auVar200 [12];
  short sVar218;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  short sVar219;
  short sVar220;
  undefined1 auVar207 [16];
  undefined4 uVar221;
  undefined1 auVar222 [12];
  short sVar230;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  ushort uVar231;
  short sVar232;
  undefined1 auVar233 [12];
  ushort uVar237;
  ushort uVar239;
  ushort uVar241;
  ushort uVar243;
  ushort uVar245;
  ushort uVar247;
  ushort uVar249;
  undefined1 auVar234 [16];
  short sVar238;
  short sVar240;
  short sVar242;
  short sVar244;
  short sVar246;
  short sVar248;
  short sVar250;
  undefined1 auVar235 [16];
  undefined1 auVar251 [12];
  short sVar257;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  ushort uVar258;
  ushort uVar266;
  ushort uVar267;
  ushort uVar268;
  ushort uVar269;
  ushort uVar270;
  ushort uVar271;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  ushort uVar272;
  undefined1 auVar261 [16];
  undefined1 auVar265 [16];
  undefined1 auVar273 [12];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar296 [12];
  undefined1 auVar297 [16];
  undefined1 auVar300 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar312 [12];
  undefined1 auVar313 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  ushort uVar325;
  ushort uVar338;
  ushort uVar340;
  ushort uVar341;
  ushort uVar342;
  ushort uVar343;
  ushort uVar344;
  undefined1 auVar326 [16];
  undefined1 auVar329 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  ushort uVar345;
  undefined1 auVar335 [16];
  undefined1 auVar346 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  ushort uVar358;
  undefined1 auVar359 [12];
  ushort uVar364;
  ushort uVar365;
  ushort uVar366;
  ushort uVar368;
  short sVar371;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  ushort uVar370;
  ushort uVar372;
  ushort uVar373;
  undefined1 auVar363 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar380 [12];
  undefined1 auVar381 [12];
  short sVar388;
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  __m128i flat2_p [6];
  undefined8 local_398;
  undefined8 uStack_390;
  short local_388;
  uint16_t uStack_386;
  short sStack_384;
  uint16_t uStack_382;
  short sStack_380;
  uint16_t uStack_37e;
  short sStack_37c;
  uint16_t uStack_37a;
  undefined8 local_338;
  undefined8 uStack_330;
  ushort local_2d8;
  ushort uStack_2d6;
  ushort uStack_2d4;
  ushort uStack_2d2;
  ushort uStack_2d0;
  ushort uStack_2ce;
  ushort uStack_2cc;
  ushort uStack_2ca;
  ushort local_2c8;
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2c0;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  ushort local_2b8;
  ushort uStack_2b6;
  ushort uStack_2b4;
  ushort uStack_2b2;
  ushort uStack_2b0;
  ushort uStack_2ae;
  ushort uStack_2ac;
  ushort uStack_2aa;
  ushort local_2a8;
  ushort uStack_2a6;
  ushort uStack_2a4;
  ushort uStack_2a2;
  ushort uStack_2a0;
  ushort uStack_29e;
  ushort uStack_29c;
  ushort uStack_29a;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined8 uStack_220;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  uint16_t uStack_20e;
  short sStack_20c;
  uint16_t uStack_20a;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  ushort local_f8;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  ushort local_d8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  ushort local_98;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  ushort local_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_80;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  ushort local_78;
  ushort uStack_76;
  ushort uStack_74;
  ushort uStack_72;
  ushort uStack_70;
  ushort uStack_6e;
  ushort uStack_6c;
  ushort uStack_6a;
  ushort local_68;
  ushort uStack_66;
  ushort uStack_64;
  ushort uStack_62;
  ushort uStack_60;
  ushort uStack_5e;
  ushort uStack_5c;
  ushort uStack_5a;
  ushort local_58;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  ushort local_48;
  ushort uStack_46;
  ushort uStack_44;
  ushort uStack_42;
  ushort uStack_40;
  ushort uStack_3e;
  ushort uStack_3c;
  ushort uStack_3a;
  undefined1 auVar168 [12];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  short sVar184;
  short sVar185;
  short sVar188;
  short sVar189;
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  short sVar211;
  short sVar212;
  short sVar214;
  short sVar215;
  undefined1 auVar223 [12];
  undefined1 auVar227 [16];
  short sVar228;
  short sVar229;
  undefined1 auVar236 [16];
  short sVar255;
  short sVar256;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar275 [16];
  undefined1 auVar282 [16];
  undefined1 auVar276 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  short sVar286;
  short sVar287;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  short sVar295;
  undefined1 auVar301 [16];
  undefined1 auVar298 [16];
  undefined1 auVar302 [16];
  undefined1 auVar299 [16];
  undefined1 auVar303 [16];
  undefined1 auVar307 [16];
  short sVar308;
  short sVar309;
  short sVar310;
  short sVar311;
  undefined1 auVar319 [16];
  undefined1 auVar314 [16];
  undefined1 auVar320 [16];
  undefined1 auVar315 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  short sVar323;
  short sVar324;
  undefined1 auVar327 [16];
  undefined1 auVar330 [16];
  undefined1 auVar328 [16];
  undefined1 auVar331 [16];
  short sVar336;
  short sVar337;
  short sVar339;
  undefined1 auVar347 [16];
  undefined1 auVar352 [16];
  undefined1 auVar348 [16];
  undefined1 auVar353 [16];
  short sVar354;
  short sVar355;
  short sVar367;
  short sVar369;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar385 [16];
  short sVar386;
  short sVar387;
  
  auVar4 = *(undefined1 (*) [16])(s + -8);
  puVar2 = s + (long)pitch + -8;
  uVar51 = *puVar2;
  uVar52 = puVar2[1];
  uVar53 = puVar2[2];
  uStack_20e = puVar2[3];
  uVar54 = puVar2[4];
  uVar55 = puVar2[5];
  uVar56 = puVar2[6];
  uVar57 = puVar2[7];
  lVar157 = (long)(pitch * 2);
  auVar173 = *(undefined1 (*) [16])(s + lVar157 + -8);
  lVar159 = (long)(pitch * 3);
  puVar2 = s + lVar159 + -8;
  uVar58 = *puVar2;
  uVar59 = puVar2[1];
  uVar60 = puVar2[2];
  uStack_20a = puVar2[3];
  uVar61 = puVar2[4];
  uVar62 = puVar2[5];
  uVar63 = puVar2[6];
  uVar64 = puVar2[7];
  lVar151 = (long)(pitch * 4);
  auVar174 = *(undefined1 (*) [16])(s + lVar151 + -8);
  lVar160 = (long)(pitch * 5);
  puVar2 = s + lVar160 + -8;
  uVar65 = *puVar2;
  uVar66 = puVar2[1];
  uVar67 = puVar2[2];
  uVar68 = puVar2[4];
  uVar69 = puVar2[5];
  uVar70 = puVar2[6];
  uVar71 = puVar2[7];
  lVar161 = (long)(pitch * 6);
  auVar176 = *(undefined1 (*) [16])(s + lVar161 + -8);
  lVar153 = (long)(pitch * 7);
  puVar3 = s + lVar153 + -8;
  uVar72 = *puVar3;
  uVar73 = puVar3[1];
  uVar74 = puVar3[2];
  uVar75 = puVar3[4];
  uVar76 = puVar3[5];
  uVar77 = puVar3[6];
  uVar78 = puVar3[7];
  sStack_210 = auVar4._6_2_;
  auVar299._0_12_ = auVar4._0_12_;
  auVar299._12_2_ = sStack_210;
  auVar299._14_2_ = uStack_20e;
  auVar298._12_4_ = auVar299._12_4_;
  auVar298._0_10_ = auVar4._0_10_;
  auVar298._10_2_ = uVar53;
  sVar310 = auVar4._4_2_;
  auVar297._10_6_ = auVar298._10_6_;
  auVar297._0_8_ = auVar4._0_8_;
  auVar297._8_2_ = sVar310;
  auVar109._4_8_ = auVar297._8_8_;
  auVar109._2_2_ = uVar52;
  sVar308 = auVar4._2_2_;
  auVar109._0_2_ = sVar308;
  auVar356._0_8_ = auVar109._0_8_ << 0x20;
  sStack_20c = auVar173._6_2_;
  auVar315._0_12_ = auVar173._0_12_;
  auVar315._12_2_ = sStack_20c;
  auVar315._14_2_ = uStack_20a;
  auVar314._12_4_ = auVar315._12_4_;
  auVar314._0_10_ = auVar173._0_10_;
  auVar314._10_2_ = uVar60;
  sVar324 = auVar173._4_2_;
  auVar313._10_6_ = auVar314._10_6_;
  auVar313._0_8_ = auVar173._0_8_;
  auVar313._8_2_ = sVar324;
  auVar110._4_8_ = auVar313._8_8_;
  auVar110._2_2_ = uVar59;
  sVar323 = auVar173._2_2_;
  auVar110._0_2_ = sVar323;
  uVar165 = CONCAT22(uVar58,auVar173._0_2_);
  auVar328._0_12_ = auVar174._0_12_;
  auVar328._12_2_ = auVar174._6_2_;
  auVar328._14_2_ = puVar2[3];
  auVar327._12_4_ = auVar328._12_4_;
  auVar327._0_10_ = auVar174._0_10_;
  auVar327._10_2_ = uVar67;
  sVar339 = auVar174._4_2_;
  auVar326._10_6_ = auVar327._10_6_;
  auVar326._0_8_ = auVar174._0_8_;
  auVar326._8_2_ = sVar339;
  auVar111._4_8_ = auVar326._8_8_;
  auVar111._2_2_ = uVar66;
  sVar336 = auVar174._2_2_;
  auVar111._0_2_ = sVar336;
  auVar360._0_8_ = auVar111._0_8_ << 0x20;
  auVar348._0_12_ = auVar176._0_12_;
  auVar348._12_2_ = auVar176._6_2_;
  auVar348._14_2_ = puVar3[3];
  auVar347._12_4_ = auVar348._12_4_;
  auVar347._0_10_ = auVar176._0_10_;
  auVar347._10_2_ = uVar74;
  sVar355 = auVar176._4_2_;
  auVar346._10_6_ = auVar347._10_6_;
  auVar346._0_8_ = auVar176._0_8_;
  auVar346._8_2_ = sVar355;
  auVar112._4_8_ = auVar346._8_8_;
  auVar112._2_2_ = uVar73;
  sVar354 = auVar176._2_2_;
  auVar112._0_2_ = sVar354;
  auVar356._8_4_ = auVar109._0_4_;
  auVar356._12_4_ = auVar110._0_4_;
  local_1f8 = auVar356._8_8_;
  auVar360._8_4_ = auVar111._0_4_;
  auVar360._12_4_ = auVar112._0_4_;
  uStack_1f0 = auVar360._8_8_;
  uStack_200 = auVar326._8_4_;
  uStack_1fc = auVar346._8_4_;
  local_208 = auVar327._12_4_;
  uStack_204 = auVar347._12_4_;
  sVar228 = auVar4._8_2_;
  sVar229 = auVar4._10_2_;
  auVar222._0_8_ = CONCAT26(uVar55,CONCAT24(sVar229,CONCAT22(uVar54,sVar228)));
  sVar230 = auVar4._12_2_;
  auVar222._8_2_ = sVar230;
  auVar222._10_2_ = uVar56;
  sVar181 = auVar4._14_2_;
  auVar252._12_2_ = sVar181;
  auVar252._0_12_ = auVar222;
  auVar252._14_2_ = uVar57;
  sVar184 = auVar173._8_2_;
  sVar188 = auVar173._10_2_;
  auVar166._0_8_ = CONCAT26(uVar62,CONCAT24(sVar188,CONCAT22(uVar61,sVar184)));
  sVar192 = auVar173._12_2_;
  auVar166._8_2_ = sVar192;
  auVar166._10_2_ = uVar63;
  sVar163 = auVar173._14_2_;
  auVar169._12_2_ = sVar163;
  auVar169._0_12_ = auVar166;
  auVar169._14_2_ = uVar64;
  sVar211 = auVar174._8_2_;
  sVar214 = auVar174._10_2_;
  auVar199._0_8_ = CONCAT26(uVar69,CONCAT24(sVar214,CONCAT22(uVar68,sVar211)));
  sVar217 = auVar174._12_2_;
  auVar199._8_2_ = sVar217;
  auVar199._10_2_ = uVar70;
  sVar179 = auVar174._14_2_;
  auVar202._12_2_ = sVar179;
  auVar202._0_12_ = auVar199;
  auVar202._14_2_ = uVar71;
  sVar255 = auVar176._8_2_;
  sVar256 = auVar176._10_2_;
  auVar251._0_8_ = CONCAT26(uVar76,CONCAT24(sVar256,CONCAT22(uVar75,sVar255)));
  sVar257 = auVar176._12_2_;
  auVar251._8_2_ = sVar257;
  auVar251._10_2_ = uVar77;
  sVar183 = auVar176._14_2_;
  auVar361._12_2_ = sVar183;
  auVar361._0_12_ = auVar251;
  auVar361._14_2_ = uVar78;
  auVar259._8_4_ = (int)((ulong)auVar222._0_8_ >> 0x20);
  auVar259._0_8_ = auVar222._0_8_;
  auVar259._12_4_ = (int)((ulong)auVar166._0_8_ >> 0x20);
  auVar260._8_4_ = (int)((ulong)auVar199._0_8_ >> 0x20);
  auVar260._0_8_ = auVar199._0_8_;
  auVar260._12_4_ = (int)((ulong)auVar251._0_8_ >> 0x20);
  local_228 = CONCAT44(CONCAT22(uVar61,sVar184),CONCAT22(uVar54,sVar228));
  uStack_220 = CONCAT44(CONCAT22(uVar75,sVar255),CONCAT22(uVar68,sVar211));
  local_238._8_8_ = auVar260._8_8_;
  local_238._0_8_ = auVar259._8_8_;
  local_248._4_4_ = auVar166._8_4_;
  local_248._0_4_ = auVar222._8_4_;
  auVar253._8_4_ = auVar252._12_4_;
  auVar253._0_8_ = local_248._0_8_;
  auVar253._12_4_ = auVar169._12_4_;
  local_248._12_4_ = auVar251._8_4_;
  local_248._8_4_ = auVar199._8_4_;
  auVar203._8_4_ = auVar202._12_4_;
  auVar203._0_8_ = local_248._8_8_;
  auVar203._12_4_ = auVar361._12_4_;
  local_258._8_8_ = auVar203._8_8_;
  local_258._0_8_ = auVar253._8_8_;
  auVar169 = *(undefined1 (*) [16])s;
  puVar2 = s + pitch;
  uVar79 = *puVar2;
  uVar80 = puVar2[1];
  uVar81 = puVar2[3];
  uVar82 = puVar2[4];
  uVar83 = puVar2[5];
  uVar84 = puVar2[6];
  uVar85 = puVar2[7];
  auVar171 = *(undefined1 (*) [16])(s + lVar157);
  puVar3 = s + lVar159;
  uVar86 = *puVar3;
  uVar87 = puVar3[1];
  uVar88 = puVar3[3];
  uVar89 = puVar3[4];
  uVar90 = puVar3[5];
  uVar91 = puVar3[6];
  auVar202 = *(undefined1 (*) [16])(s + lVar151);
  puVar1 = s + lVar160;
  uVar92 = *puVar1;
  uVar93 = puVar1[1];
  uStack_37e = puVar1[2];
  uStack_386 = puVar1[3];
  uVar94 = puVar1[4];
  uVar95 = puVar1[5];
  uVar96 = puVar1[6];
  uVar97 = puVar1[7];
  sVar311 = auVar169._6_2_;
  auVar303._0_12_ = auVar169._0_12_;
  auVar303._12_2_ = sVar311;
  auVar303._14_2_ = uVar81;
  auVar302._12_4_ = auVar303._12_4_;
  auVar302._0_10_ = auVar169._0_10_;
  auVar302._10_2_ = puVar2[2];
  auVar301._10_6_ = auVar302._10_6_;
  auVar301._0_8_ = auVar169._0_8_;
  auVar301._8_2_ = auVar169._4_2_;
  auVar113._4_8_ = auVar301._8_8_;
  auVar113._2_2_ = uVar80;
  sVar309 = auVar169._2_2_;
  auVar113._0_2_ = sVar309;
  sVar195 = auVar169._0_2_;
  auVar300._0_4_ = CONCAT22(uVar79,sVar195);
  auVar300._4_12_ = auVar113;
  sVar287 = auVar171._6_2_;
  auVar276._0_12_ = auVar171._0_12_;
  auVar276._12_2_ = sVar287;
  auVar276._14_2_ = uVar88;
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._0_10_ = auVar171._0_10_;
  auVar275._10_2_ = puVar3[2];
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._0_8_ = auVar171._0_8_;
  auVar274._8_2_ = auVar171._4_2_;
  auVar114._4_8_ = auVar274._8_8_;
  auVar114._2_2_ = uVar87;
  sVar286 = auVar171._2_2_;
  auVar114._0_2_ = sVar286;
  sVar187 = auVar171._0_2_;
  local_1e8._6_2_ = uVar86;
  local_1e8._4_2_ = sVar187;
  local_388 = auVar202._6_2_;
  auVar291._0_12_ = auVar202._0_12_;
  auVar291._12_2_ = local_388;
  auVar291._14_2_ = uStack_386;
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._0_10_ = auVar202._0_10_;
  auVar290._10_2_ = uStack_37e;
  sStack_380 = auVar202._4_2_;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._0_8_ = auVar202._0_8_;
  auVar289._8_2_ = sStack_380;
  auVar115._4_8_ = auVar289._8_8_;
  auVar115._2_2_ = uVar93;
  sVar295 = auVar202._2_2_;
  auVar115._0_2_ = sVar295;
  sVar191 = auVar202._0_2_;
  auVar288._0_4_ = CONCAT22(uVar92,sVar191);
  auVar288._4_12_ = auVar115;
  auVar203 = *(undefined1 (*) [16])(s + lVar161);
  puVar2 = s + lVar153;
  uVar98 = *puVar2;
  uVar99 = puVar2[1];
  uStack_37a = puVar2[2];
  uStack_382 = puVar2[3];
  uVar100 = puVar2[4];
  uVar101 = puVar2[5];
  uVar102 = puVar2[6];
  uVar103 = puVar2[7];
  sStack_384 = auVar203._6_2_;
  auVar331._0_12_ = auVar203._0_12_;
  auVar331._12_2_ = sStack_384;
  auVar331._14_2_ = uStack_382;
  auVar330._12_4_ = auVar331._12_4_;
  auVar330._0_10_ = auVar203._0_10_;
  auVar330._10_2_ = uStack_37a;
  sStack_37c = auVar203._4_2_;
  auVar329._10_6_ = auVar330._10_6_;
  auVar329._0_8_ = auVar203._0_8_;
  auVar329._8_2_ = sStack_37c;
  auVar116._4_8_ = auVar329._8_8_;
  auVar116._2_2_ = uVar99;
  sVar337 = auVar203._2_2_;
  auVar116._0_2_ = sVar337;
  sVar197 = auVar203._0_2_;
  local_1e8._14_2_ = uVar98;
  local_1e8._12_2_ = sVar197;
  auVar374._0_8_ = auVar300._0_8_;
  auVar374._8_4_ = auVar113._0_4_;
  auVar374._12_4_ = auVar114._0_4_;
  local_1e8._0_4_ = auVar300._0_4_;
  auVar349._0_8_ = auVar288._0_8_;
  auVar349._8_4_ = auVar115._0_4_;
  auVar349._12_4_ = auVar116._0_4_;
  local_1e8._8_4_ = auVar288._0_4_;
  local_1d8._8_8_ = auVar349._8_8_;
  local_1d8._0_8_ = auVar374._8_8_;
  sVar386 = auVar169._8_2_;
  local_1a8 = CONCAT22(uVar82,sVar386);
  sVar387 = auVar169._10_2_;
  auVar380._0_8_ = CONCAT26(uVar83,CONCAT24(sVar387,local_1a8));
  sVar388 = auVar169._12_2_;
  auVar380._8_2_ = sVar388;
  auVar380._10_2_ = uVar84;
  sVar185 = auVar171._8_2_;
  sVar189 = auVar171._10_2_;
  auVar167._0_8_ = CONCAT26(uVar90,CONCAT24(sVar189,CONCAT22(uVar89,sVar185)));
  sVar193 = auVar171._12_2_;
  auVar167._8_2_ = sVar193;
  auVar167._10_2_ = uVar91;
  sVar367 = auVar202._8_2_;
  sVar369 = auVar202._10_2_;
  auVar359._0_8_ = CONCAT26(uVar95,CONCAT24(sVar369,CONCAT22(uVar94,sVar367)));
  sVar371 = auVar202._12_2_;
  auVar359._8_2_ = sVar371;
  auVar359._10_2_ = uVar96;
  sVar212 = auVar203._8_2_;
  sVar215 = auVar203._10_2_;
  auVar200._0_8_ = CONCAT26(uVar101,CONCAT24(sVar215,CONCAT22(uVar100,sVar212)));
  sVar218 = auVar203._12_2_;
  auVar200._8_2_ = sVar218;
  auVar200._10_2_ = uVar102;
  auVar362._8_4_ = (int)((ulong)auVar380._0_8_ >> 0x20);
  auVar362._0_8_ = auVar380._0_8_;
  auVar362._12_4_ = (int)((ulong)auVar167._0_8_ >> 0x20);
  local_338 = auVar362._8_8_;
  auVar277._8_4_ = (int)((ulong)auVar359._0_8_ >> 0x20);
  auVar277._0_8_ = auVar359._0_8_;
  auVar277._12_4_ = (int)((ulong)auVar200._0_8_ >> 0x20);
  uStack_330 = auVar277._8_8_;
  local_1c8._4_4_ = auVar274._8_4_;
  local_1c8._0_4_ = auVar301._8_4_;
  local_1c8._8_4_ = auVar289._8_4_;
  local_1c8._12_4_ = auVar329._8_4_;
  uStack_390 = CONCAT44(auVar275._12_4_,auVar302._12_4_);
  uStack_1b0 = auVar302._12_4_;
  uStack_1ac = auVar275._12_4_;
  uStack_1a4 = CONCAT22(uVar89,sVar185);
  uStack_1a0 = CONCAT44(CONCAT22(uVar100,sVar212),CONCAT22(uVar94,sVar367));
  local_198 = local_338;
  uStack_190 = uStack_330;
  local_188 = auVar380._8_4_;
  uStack_184 = auVar167._8_4_;
  uStack_180 = auVar359._8_4_;
  uStack_17c = auVar200._8_4_;
  auVar171 = *(undefined1 (*) [16])blimit0;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar171._0_13_;
  auVar10[0xe] = auVar171[7];
  auVar16[0xc] = auVar171[6];
  auVar16._0_12_ = auVar171._0_12_;
  auVar16._13_2_ = auVar10._13_2_;
  auVar22[0xb] = 0;
  auVar22._0_11_ = auVar171._0_11_;
  auVar22._12_3_ = auVar16._12_3_;
  auVar28[10] = auVar171[5];
  auVar28._0_10_ = auVar171._0_10_;
  auVar28._11_4_ = auVar22._11_4_;
  auVar34[9] = 0;
  auVar34._0_9_ = auVar171._0_9_;
  auVar34._10_5_ = auVar28._10_5_;
  auVar40[8] = auVar171[4];
  auVar40._0_8_ = auVar171._0_8_;
  auVar40._9_6_ = auVar34._9_6_;
  auVar117._7_8_ = 0;
  auVar117._0_7_ = auVar40._8_7_;
  auVar131._1_8_ = SUB158(auVar117 << 0x40,7);
  auVar131[0] = auVar171[3];
  auVar131._9_6_ = 0;
  auVar132._1_10_ = SUB1510(auVar131 << 0x30,5);
  auVar132[0] = auVar171[2];
  auVar132._11_4_ = 0;
  auVar50._3_12_ = SUB1512(auVar132 << 0x20,3);
  auVar50[2] = auVar171[1];
  auVar50[1] = 0;
  auVar50[0] = auVar171[0];
  auVar171 = *(undefined1 (*) [16])blimit1;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar171._0_13_;
  auVar5[0xe] = auVar171[7];
  auVar11[0xc] = auVar171[6];
  auVar11._0_12_ = auVar171._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar171._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar171[5];
  auVar23._0_10_ = auVar171._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar171._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar171[4];
  auVar35._0_8_ = auVar171._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar118._7_8_ = 0;
  auVar118._0_7_ = auVar35._8_7_;
  auVar133._1_8_ = SUB158(auVar118 << 0x40,7);
  auVar133[0] = auVar171[3];
  auVar133._9_6_ = 0;
  auVar134._1_10_ = SUB1510(auVar133 << 0x30,5);
  auVar134[0] = auVar171[2];
  auVar134._11_4_ = 0;
  auVar41[2] = auVar171[1];
  auVar41._0_2_ = auVar171._0_2_;
  auVar41._3_12_ = SUB1512(auVar134 << 0x20,3);
  auVar45._2_13_ = auVar41._2_13_;
  auVar45._0_2_ = auVar171._0_2_ & 0xff;
  auVar170._0_8_ = auVar50._0_8_;
  auVar170._8_8_ = auVar45._0_8_;
  auVar171 = *(undefined1 (*) [16])limit0;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar171._0_13_;
  auVar6[0xe] = auVar171[7];
  auVar12[0xc] = auVar171[6];
  auVar12._0_12_ = auVar171._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar171._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar171[5];
  auVar24._0_10_ = auVar171._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar171._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar171[4];
  auVar36._0_8_ = auVar171._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar119._7_8_ = 0;
  auVar119._0_7_ = auVar36._8_7_;
  auVar135._1_8_ = SUB158(auVar119 << 0x40,7);
  auVar135[0] = auVar171[3];
  auVar135._9_6_ = 0;
  auVar136._1_10_ = SUB1510(auVar135 << 0x30,5);
  auVar136[0] = auVar171[2];
  auVar136._11_4_ = 0;
  auVar46._3_12_ = SUB1512(auVar136 << 0x20,3);
  auVar46[2] = auVar171[1];
  auVar46[1] = 0;
  auVar46[0] = auVar171[0];
  auVar171 = *(undefined1 (*) [16])limit1;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar171._0_13_;
  auVar7[0xe] = auVar171[7];
  auVar13[0xc] = auVar171[6];
  auVar13._0_12_ = auVar171._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar171._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar171[5];
  auVar25._0_10_ = auVar171._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar171._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar171[4];
  auVar37._0_8_ = auVar171._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar120._7_8_ = 0;
  auVar120._0_7_ = auVar37._8_7_;
  auVar137._1_8_ = SUB158(auVar120 << 0x40,7);
  auVar137[0] = auVar171[3];
  auVar137._9_6_ = 0;
  auVar138._1_10_ = SUB1510(auVar137 << 0x30,5);
  auVar138[0] = auVar171[2];
  auVar138._11_4_ = 0;
  auVar42[2] = auVar171[1];
  auVar42._0_2_ = auVar171._0_2_;
  auVar42._3_12_ = SUB1512(auVar138 << 0x20,3);
  auVar47._2_13_ = auVar42._2_13_;
  auVar47._0_2_ = auVar171._0_2_ & 0xff;
  auVar292._0_8_ = auVar46._0_8_;
  auVar292._8_8_ = auVar47._0_8_;
  auVar171 = *(undefined1 (*) [16])thresh0;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar171._0_13_;
  auVar8[0xe] = auVar171[7];
  auVar14[0xc] = auVar171[6];
  auVar14._0_12_ = auVar171._0_12_;
  auVar14._13_2_ = auVar8._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar171._0_11_;
  auVar20._12_3_ = auVar14._12_3_;
  auVar26[10] = auVar171[5];
  auVar26._0_10_ = auVar171._0_10_;
  auVar26._11_4_ = auVar20._11_4_;
  auVar32[9] = 0;
  auVar32._0_9_ = auVar171._0_9_;
  auVar32._10_5_ = auVar26._10_5_;
  auVar38[8] = auVar171[4];
  auVar38._0_8_ = auVar171._0_8_;
  auVar38._9_6_ = auVar32._9_6_;
  auVar121._7_8_ = 0;
  auVar121._0_7_ = auVar38._8_7_;
  auVar139._1_8_ = SUB158(auVar121 << 0x40,7);
  auVar139[0] = auVar171[3];
  auVar139._9_6_ = 0;
  auVar140._1_10_ = SUB1510(auVar139 << 0x30,5);
  auVar140[0] = auVar171[2];
  auVar140._11_4_ = 0;
  auVar43[2] = auVar171[1];
  auVar43._0_2_ = auVar171._0_2_;
  auVar43._3_12_ = SUB1512(auVar140 << 0x20,3);
  auVar48._2_13_ = auVar43._2_13_;
  auVar48._0_2_ = auVar171._0_2_ & 0xff;
  auVar171 = *(undefined1 (*) [16])thresh1;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar171._0_13_;
  auVar9[0xe] = auVar171[7];
  auVar15[0xc] = auVar171[6];
  auVar15._0_12_ = auVar171._0_12_;
  auVar15._13_2_ = auVar9._13_2_;
  auVar21[0xb] = 0;
  auVar21._0_11_ = auVar171._0_11_;
  auVar21._12_3_ = auVar15._12_3_;
  auVar27[10] = auVar171[5];
  auVar27._0_10_ = auVar171._0_10_;
  auVar27._11_4_ = auVar21._11_4_;
  auVar33[9] = 0;
  auVar33._0_9_ = auVar171._0_9_;
  auVar33._10_5_ = auVar27._10_5_;
  auVar39[8] = auVar171[4];
  auVar39._0_8_ = auVar171._0_8_;
  auVar39._9_6_ = auVar33._9_6_;
  auVar122._7_8_ = 0;
  auVar122._0_7_ = auVar39._8_7_;
  auVar141._1_8_ = SUB158(auVar122 << 0x40,7);
  auVar141[0] = auVar171[3];
  auVar141._9_6_ = 0;
  auVar142._1_10_ = SUB1510(auVar141 << 0x30,5);
  auVar142[0] = auVar171[2];
  auVar142._11_4_ = 0;
  auVar44[2] = auVar171[1];
  auVar44._0_2_ = auVar171._0_2_;
  auVar44._3_12_ = SUB1512(auVar142 << 0x20,3);
  auVar49._2_13_ = auVar44._2_13_;
  auVar49._0_2_ = auVar171._0_2_ & 0xff;
  auVar280._0_8_ = auVar48._0_8_;
  auVar280._8_8_ = auVar49._0_8_;
  auVar252 = psubusw(local_258,local_1e8);
  auVar260 = psubusw(local_1e8,local_258);
  auVar171._8_8_ = local_248._8_8_;
  auVar171._0_8_ = local_248._0_8_;
  auVar253 = psubusw(auVar171,local_1d8);
  auVar277 = psubusw(local_1d8,auVar171);
  auVar277 = auVar277 | auVar253;
  auVar361 = ZEXT416(bd - 8);
  auVar170 = psllw(auVar170,auVar361);
  auVar252 = paddusw(auVar260 | auVar252,auVar260 | auVar252);
  auVar278._0_2_ = auVar277._0_2_ >> 1;
  auVar278._2_2_ = auVar277._2_2_ >> 1;
  auVar278._4_2_ = auVar277._4_2_ >> 1;
  auVar278._6_2_ = auVar277._6_2_ >> 1;
  auVar278._8_2_ = auVar277._8_2_ >> 1;
  auVar278._10_2_ = auVar277._10_2_ >> 1;
  auVar278._12_2_ = auVar277._12_2_ >> 1;
  auVar278._14_2_ = auVar277._14_2_ >> 1;
  auVar252 = paddusw(auVar278,auVar252);
  auVar252 = auVar252 ^ _DAT_004db9a0;
  auVar170 = auVar170 ^ _DAT_004db9a0;
  auVar279._0_2_ = -(ushort)(auVar170._0_2_ < auVar252._0_2_);
  auVar279._2_2_ = -(ushort)(auVar170._2_2_ < auVar252._2_2_);
  auVar279._4_2_ = -(ushort)(auVar170._4_2_ < auVar252._4_2_);
  auVar279._6_2_ = -(ushort)(auVar170._6_2_ < auVar252._6_2_);
  auVar279._8_2_ = -(ushort)(auVar170._8_2_ < auVar252._8_2_);
  auVar279._10_2_ = -(ushort)(auVar170._10_2_ < auVar252._10_2_);
  auVar279._12_2_ = -(ushort)(auVar170._12_2_ < auVar252._12_2_);
  auVar279._14_2_ = -(ushort)(auVar170._14_2_ < auVar252._14_2_);
  auVar260 = psllw(auVar292,auVar361);
  auVar316 = paddusw(_DAT_00515ce0,auVar260);
  auVar316 = auVar316 & auVar279;
  lVar148 = 0x10;
  auVar253 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar170 = local_1e8;
  auVar252 = local_258;
  do {
    auVar277 = *(undefined1 (*) [16])(local_258 + lVar148);
    auVar292 = psubusw(auVar277,auVar252);
    auVar252 = psubusw(auVar252,auVar277);
    auVar252 = auVar252 | auVar292;
    sVar162 = auVar316._0_2_;
    sVar178 = auVar252._0_2_;
    uVar258 = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
    sVar162 = auVar316._2_2_;
    sVar178 = auVar252._2_2_;
    uVar266 = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
    sVar162 = auVar316._4_2_;
    sVar178 = auVar252._4_2_;
    uVar267 = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
    sVar162 = auVar316._6_2_;
    sVar178 = auVar252._6_2_;
    uVar268 = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
    sVar162 = auVar316._8_2_;
    sVar178 = auVar252._8_2_;
    uVar269 = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
    sVar162 = auVar316._10_2_;
    sVar178 = auVar252._10_2_;
    uVar270 = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
    sVar162 = auVar316._12_2_;
    sVar178 = auVar252._12_2_;
    sVar180 = auVar252._14_2_;
    uVar271 = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
    sVar162 = auVar316._14_2_;
    uVar272 = (ushort)(sVar180 < sVar162) * sVar162 | (ushort)(sVar180 >= sVar162) * sVar180;
    auVar252 = *(undefined1 (*) [16])(local_1e8 + lVar148);
    auVar292 = psubusw(auVar252,auVar170);
    auVar170 = psubusw(auVar170,auVar252);
    auVar170 = auVar170 | auVar292;
    sVar162 = auVar170._0_2_;
    auVar316._0_2_ =
         (sVar162 < (short)uVar258) * uVar258 | (ushort)(sVar162 >= (short)uVar258) * sVar162;
    sVar162 = auVar170._2_2_;
    auVar316._2_2_ =
         (sVar162 < (short)uVar266) * uVar266 | (ushort)(sVar162 >= (short)uVar266) * sVar162;
    sVar162 = auVar170._4_2_;
    auVar316._4_2_ =
         (sVar162 < (short)uVar267) * uVar267 | (ushort)(sVar162 >= (short)uVar267) * sVar162;
    sVar162 = auVar170._6_2_;
    auVar316._6_2_ =
         (sVar162 < (short)uVar268) * uVar268 | (ushort)(sVar162 >= (short)uVar268) * sVar162;
    sVar162 = auVar170._8_2_;
    auVar316._8_2_ =
         (sVar162 < (short)uVar269) * uVar269 | (ushort)(sVar162 >= (short)uVar269) * sVar162;
    sVar162 = auVar170._10_2_;
    auVar316._10_2_ =
         (sVar162 < (short)uVar270) * uVar270 | (ushort)(sVar162 >= (short)uVar270) * sVar162;
    sVar162 = auVar170._12_2_;
    sVar178 = auVar170._14_2_;
    auVar316._12_2_ =
         (sVar162 < (short)uVar271) * uVar271 | (ushort)(sVar162 >= (short)uVar271) * sVar162;
    auVar316._14_2_ =
         (sVar178 < (short)uVar272) * uVar272 | (ushort)(sVar178 >= (short)uVar272) * sVar178;
    lVar148 = lVar148 + 0x10;
    auVar170 = auVar252;
    auVar252 = auVar277;
  } while (lVar148 != 0x40);
  auVar170 = pshuflw(auVar253,auVar253,0);
  uVar164 = auVar170._0_4_;
  auVar350._4_4_ = uVar164;
  auVar350._0_4_ = uVar164;
  auVar350._8_4_ = uVar164;
  auVar350._12_4_ = uVar164;
  auVar170 = psubusw(local_1d8,local_1e8);
  auVar252 = psubusw(local_1e8,local_1d8);
  auVar252 = auVar252 | auVar170;
  auVar170 = psubusw(auVar171,local_258);
  auVar253 = psubusw(local_258,auVar171);
  auVar253 = auVar253 | auVar170;
  sVar162 = auVar252._0_2_;
  sVar178 = auVar253._0_2_;
  auVar375._0_2_ = (ushort)(sVar178 < sVar162) * sVar162 | (ushort)(sVar178 >= sVar162) * sVar178;
  sVar178 = auVar252._2_2_;
  sVar180 = auVar253._2_2_;
  auVar375._2_2_ = (ushort)(sVar180 < sVar178) * sVar178 | (ushort)(sVar180 >= sVar178) * sVar180;
  sVar180 = auVar252._4_2_;
  sVar182 = auVar253._4_2_;
  auVar375._4_2_ = (ushort)(sVar182 < sVar180) * sVar180 | (ushort)(sVar182 >= sVar180) * sVar182;
  sVar182 = auVar252._6_2_;
  sVar186 = auVar253._6_2_;
  auVar375._6_2_ = (ushort)(sVar186 < sVar182) * sVar182 | (ushort)(sVar186 >= sVar182) * sVar186;
  sVar186 = auVar252._8_2_;
  sVar190 = auVar253._8_2_;
  auVar375._8_2_ = (ushort)(sVar190 < sVar186) * sVar186 | (ushort)(sVar190 >= sVar186) * sVar190;
  sVar190 = auVar252._10_2_;
  sVar194 = auVar253._10_2_;
  auVar375._10_2_ = (ushort)(sVar194 < sVar190) * sVar190 | (ushort)(sVar194 >= sVar190) * sVar194;
  sVar194 = auVar252._12_2_;
  sVar196 = auVar253._12_2_;
  sVar198 = auVar253._14_2_;
  auVar375._12_2_ = (ushort)(sVar196 < sVar194) * sVar194 | (ushort)(sVar196 >= sVar194) * sVar196;
  sVar196 = auVar252._14_2_;
  auVar375._14_2_ = (ushort)(sVar198 < sVar196) * sVar196 | (ushort)(sVar198 >= sVar196) * sVar198;
  lVar148 = 0x20;
  do {
    auVar252 = psubusw(local_258,*(undefined1 (*) [16])(local_258 + lVar148));
    auVar170 = psubusw(*(undefined1 (*) [16])(local_258 + lVar148),local_258);
    auVar170 = auVar170 | auVar252;
    sVar198 = auVar375._0_2_;
    sVar208 = auVar170._0_2_;
    uVar258 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar375._2_2_;
    sVar208 = auVar170._2_2_;
    uVar266 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar375._4_2_;
    sVar208 = auVar170._4_2_;
    uVar267 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar375._6_2_;
    sVar208 = auVar170._6_2_;
    uVar268 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar375._8_2_;
    sVar208 = auVar170._8_2_;
    uVar269 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar375._10_2_;
    sVar208 = auVar170._10_2_;
    uVar270 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar375._12_2_;
    sVar208 = auVar170._12_2_;
    sVar209 = auVar170._14_2_;
    uVar271 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar375._14_2_;
    uVar272 = (ushort)(sVar209 < sVar198) * sVar198 | (ushort)(sVar209 >= sVar198) * sVar209;
    auVar170 = psubusw(local_1e8,*(undefined1 (*) [16])(local_1e8 + lVar148));
    auVar252 = psubusw(*(undefined1 (*) [16])(local_1e8 + lVar148),local_1e8);
    auVar252 = auVar252 | auVar170;
    sVar198 = auVar252._0_2_;
    auVar375._0_2_ =
         (sVar198 < (short)uVar258) * uVar258 | (ushort)(sVar198 >= (short)uVar258) * sVar198;
    sVar198 = auVar252._2_2_;
    auVar375._2_2_ =
         (sVar198 < (short)uVar266) * uVar266 | (ushort)(sVar198 >= (short)uVar266) * sVar198;
    sVar198 = auVar252._4_2_;
    auVar375._4_2_ =
         (sVar198 < (short)uVar267) * uVar267 | (ushort)(sVar198 >= (short)uVar267) * sVar198;
    sVar198 = auVar252._6_2_;
    auVar375._6_2_ =
         (sVar198 < (short)uVar268) * uVar268 | (ushort)(sVar198 >= (short)uVar268) * sVar198;
    sVar198 = auVar252._8_2_;
    auVar375._8_2_ =
         (sVar198 < (short)uVar269) * uVar269 | (ushort)(sVar198 >= (short)uVar269) * sVar198;
    sVar198 = auVar252._10_2_;
    auVar375._10_2_ =
         (sVar198 < (short)uVar270) * uVar270 | (ushort)(sVar198 >= (short)uVar270) * sVar198;
    sVar198 = auVar252._12_2_;
    sVar208 = auVar252._14_2_;
    auVar375._12_2_ =
         (sVar198 < (short)uVar271) * uVar271 | (ushort)(sVar198 >= (short)uVar271) * sVar198;
    auVar375._14_2_ =
         (sVar208 < (short)uVar272) * uVar272 | (ushort)(sVar208 >= (short)uVar272) * sVar208;
    lVar148 = lVar148 + 0x10;
  } while (lVar148 != 0x40);
  auVar170 = psllw(auVar280,auVar361);
  auVar280 = psllw(_DAT_00515ce0,auVar361);
  auVar104._4_2_ = sVar185;
  auVar104._0_4_ = local_1a8;
  auVar104._6_2_ = uVar89;
  auVar104._8_2_ = sVar367;
  auVar104._10_2_ = uVar94;
  auVar104._12_2_ = sVar212;
  auVar104._14_2_ = uVar100;
  auVar252 = psubusw(auVar104,local_1e8);
  auVar253 = psubusw(local_1e8,auVar104);
  auVar253 = auVar253 | auVar252;
  auVar106._2_2_ = sStack_216;
  auVar106._0_2_ = local_218;
  auVar106._4_2_ = sStack_214;
  auVar106._6_2_ = sStack_212;
  auVar106._8_2_ = sStack_210;
  auVar106._10_2_ = uStack_20e;
  auVar106._12_2_ = sStack_20c;
  auVar106._14_2_ = uStack_20a;
  auVar252 = psubusw(auVar106,local_258);
  auVar277 = psubusw(local_258,auVar106);
  auVar277 = auVar277 | auVar252;
  sVar198 = auVar253._0_2_;
  sVar208 = auVar277._0_2_;
  auVar382._0_2_ = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
  sVar198 = auVar253._2_2_;
  sVar208 = auVar277._2_2_;
  auVar382._2_2_ = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
  sVar198 = auVar253._4_2_;
  sVar208 = auVar277._4_2_;
  auVar382._4_2_ = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
  sVar198 = auVar253._6_2_;
  sVar208 = auVar277._6_2_;
  auVar382._6_2_ = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
  sVar198 = auVar253._8_2_;
  sVar208 = auVar277._8_2_;
  auVar382._8_2_ = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
  sVar198 = auVar253._10_2_;
  sVar208 = auVar277._10_2_;
  auVar382._10_2_ = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
  sVar198 = auVar253._12_2_;
  sVar208 = auVar277._12_2_;
  sVar209 = auVar277._14_2_;
  auVar382._12_2_ = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
  sVar198 = auVar253._14_2_;
  auVar382._14_2_ = (ushort)(sVar209 < sVar198) * sVar198 | (ushort)(sVar209 >= sVar198) * sVar209;
  lVar148 = 0x50;
  do {
    auVar253 = psubusw(local_258,*(undefined1 (*) [16])(local_258 + lVar148));
    auVar252 = psubusw(*(undefined1 (*) [16])(local_258 + lVar148),local_258);
    auVar252 = auVar252 | auVar253;
    sVar198 = auVar382._0_2_;
    sVar208 = auVar252._0_2_;
    uVar258 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar382._2_2_;
    sVar208 = auVar252._2_2_;
    uVar266 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar382._4_2_;
    sVar208 = auVar252._4_2_;
    uVar267 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar382._6_2_;
    sVar208 = auVar252._6_2_;
    uVar268 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar382._8_2_;
    sVar208 = auVar252._8_2_;
    uVar269 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar382._10_2_;
    sVar208 = auVar252._10_2_;
    uVar270 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar382._12_2_;
    sVar208 = auVar252._12_2_;
    sVar209 = auVar252._14_2_;
    uVar271 = (ushort)(sVar208 < sVar198) * sVar198 | (ushort)(sVar208 >= sVar198) * sVar208;
    sVar198 = auVar382._14_2_;
    uVar272 = (ushort)(sVar209 < sVar198) * sVar198 | (ushort)(sVar209 >= sVar198) * sVar209;
    auVar252 = psubusw(local_1e8,*(undefined1 (*) [16])(local_1e8 + lVar148));
    auVar253 = psubusw(*(undefined1 (*) [16])(local_1e8 + lVar148),local_1e8);
    auVar253 = auVar253 | auVar252;
    sVar198 = auVar253._0_2_;
    auVar382._0_2_ =
         (sVar198 < (short)uVar258) * uVar258 | (ushort)(sVar198 >= (short)uVar258) * sVar198;
    sVar198 = auVar253._2_2_;
    auVar382._2_2_ =
         (sVar198 < (short)uVar266) * uVar266 | (ushort)(sVar198 >= (short)uVar266) * sVar198;
    sVar198 = auVar253._4_2_;
    auVar382._4_2_ =
         (sVar198 < (short)uVar267) * uVar267 | (ushort)(sVar198 >= (short)uVar267) * sVar198;
    sVar198 = auVar253._6_2_;
    auVar382._6_2_ =
         (sVar198 < (short)uVar268) * uVar268 | (ushort)(sVar198 >= (short)uVar268) * sVar198;
    sVar198 = auVar253._8_2_;
    auVar382._8_2_ =
         (sVar198 < (short)uVar269) * uVar269 | (ushort)(sVar198 >= (short)uVar269) * sVar198;
    sVar198 = auVar253._10_2_;
    auVar382._10_2_ =
         (sVar198 < (short)uVar270) * uVar270 | (ushort)(sVar198 >= (short)uVar270) * sVar198;
    sVar198 = auVar253._12_2_;
    sVar208 = auVar253._14_2_;
    auVar382._12_2_ =
         (sVar198 < (short)uVar271) * uVar271 | (ushort)(sVar198 >= (short)uVar271) * sVar198;
    auVar382._14_2_ =
         (sVar208 < (short)uVar272) * uVar272 | (ushort)(sVar208 >= (short)uVar272) * sVar208;
    lVar148 = lVar148 + 0x10;
  } while (lVar148 != 0x70);
  auVar252 = psubusw(auVar316,auVar260);
  auVar317._0_2_ = -(ushort)(auVar252._0_2_ == 0);
  auVar317._2_2_ = -(ushort)(auVar252._2_2_ == 0);
  auVar317._4_2_ = -(ushort)(auVar252._4_2_ == 0);
  auVar317._6_2_ = -(ushort)(auVar252._6_2_ == 0);
  auVar317._8_2_ = -(ushort)(auVar252._8_2_ == 0);
  auVar317._10_2_ = -(ushort)(auVar252._10_2_ == 0);
  auVar317._12_2_ = -(ushort)(auVar252._12_2_ == 0);
  auVar317._14_2_ = -(ushort)(auVar252._14_2_ == 0);
  auVar252 = psubusw(auVar375,auVar280);
  auVar376._0_2_ = -(ushort)(auVar252._0_2_ == 0);
  auVar376._2_2_ = -(ushort)(auVar252._2_2_ == 0);
  auVar376._4_2_ = -(ushort)(auVar252._4_2_ == 0);
  auVar376._6_2_ = -(ushort)(auVar252._6_2_ == 0);
  auVar376._8_2_ = -(ushort)(auVar252._8_2_ == 0);
  auVar376._10_2_ = -(ushort)(auVar252._10_2_ == 0);
  auVar376._12_2_ = -(ushort)(auVar252._12_2_ == 0);
  auVar376._14_2_ = -(ushort)(auVar252._14_2_ == 0);
  auVar292 = psubsw(local_258,auVar350);
  auVar277 = psubsw(auVar171,auVar350);
  auVar260 = psubsw(local_1e8,auVar350);
  auVar252 = psllw(_DAT_00515ce0,ZEXT416((uint)bd));
  auVar362 = psubsw(local_1d8,auVar350);
  auVar361 = psubusw(auVar171,local_258);
  auVar253 = psubusw(local_258,auVar171);
  auVar253 = auVar253 | auVar361;
  auVar304._8_4_ = 0xffffffff;
  auVar304._0_8_ = 0xffffffffffffffff;
  auVar304._12_4_ = 0xffffffff;
  auVar171 = paddsw(auVar252,auVar304);
  auVar171 = psubsw(auVar171,auVar350);
  sVar198 = auVar253._0_2_;
  auVar224._0_2_ = (ushort)(sVar198 < sVar162) * sVar162 | (ushort)(sVar198 >= sVar162) * sVar198;
  sVar162 = auVar253._2_2_;
  auVar224._2_2_ = (ushort)(sVar162 < sVar178) * sVar178 | (ushort)(sVar162 >= sVar178) * sVar162;
  sVar162 = auVar253._4_2_;
  auVar224._4_2_ = (ushort)(sVar162 < sVar180) * sVar180 | (ushort)(sVar162 >= sVar180) * sVar162;
  sVar162 = auVar253._6_2_;
  auVar224._6_2_ = (ushort)(sVar162 < sVar182) * sVar182 | (ushort)(sVar162 >= sVar182) * sVar162;
  sVar162 = auVar253._8_2_;
  auVar224._8_2_ = (ushort)(sVar162 < sVar186) * sVar186 | (ushort)(sVar162 >= sVar186) * sVar162;
  sVar162 = auVar253._10_2_;
  auVar224._10_2_ = (ushort)(sVar162 < sVar190) * sVar190 | (ushort)(sVar162 >= sVar190) * sVar162;
  sVar162 = auVar253._12_2_;
  sVar178 = auVar253._14_2_;
  auVar224._12_2_ = (ushort)(sVar162 < sVar194) * sVar194 | (ushort)(sVar162 >= sVar194) * sVar162;
  auVar224._14_2_ = (ushort)(sVar178 < sVar196) * sVar196 | (ushort)(sVar178 >= sVar196) * sVar178;
  auVar252 = psubsw((undefined1  [16])0x0,auVar350);
  auVar224 = auVar224 ^ _DAT_004db9a0;
  auVar170 = auVar170 ^ _DAT_004db9a0;
  auVar253 = psubsw(auVar277,auVar362);
  sVar198 = auVar171._0_2_;
  sVar162 = auVar253._0_2_;
  uVar258 = (ushort)(sVar198 < sVar162) * sVar198 | (ushort)(sVar198 >= sVar162) * sVar162;
  sVar208 = auVar171._2_2_;
  sVar162 = auVar253._2_2_;
  uVar266 = (ushort)(sVar208 < sVar162) * sVar208 | (ushort)(sVar208 >= sVar162) * sVar162;
  sVar209 = auVar171._4_2_;
  sVar162 = auVar253._4_2_;
  uVar267 = (ushort)(sVar209 < sVar162) * sVar209 | (ushort)(sVar209 >= sVar162) * sVar162;
  sVar210 = auVar171._6_2_;
  sVar162 = auVar253._6_2_;
  uVar268 = (ushort)(sVar210 < sVar162) * sVar210 | (ushort)(sVar210 >= sVar162) * sVar162;
  sVar213 = auVar171._8_2_;
  sVar162 = auVar253._8_2_;
  uVar269 = (ushort)(sVar213 < sVar162) * sVar213 | (ushort)(sVar213 >= sVar162) * sVar162;
  sVar216 = auVar171._10_2_;
  sVar162 = auVar253._10_2_;
  uVar270 = (ushort)(sVar216 < sVar162) * sVar216 | (ushort)(sVar216 >= sVar162) * sVar162;
  sVar219 = auVar171._12_2_;
  sVar162 = auVar253._12_2_;
  sVar178 = auVar253._14_2_;
  uVar271 = (ushort)(sVar219 < sVar162) * sVar219 | (ushort)(sVar219 >= sVar162) * sVar162;
  sVar220 = auVar171._14_2_;
  uVar272 = (ushort)(sVar220 < sVar178) * sVar220 | (ushort)(sVar220 >= sVar178) * sVar178;
  sVar162 = auVar252._0_2_;
  auVar332._0_2_ =
       (ushort)((short)uVar258 < sVar162) * sVar162 | ((short)uVar258 >= sVar162) * uVar258;
  sVar178 = auVar252._2_2_;
  auVar332._2_2_ =
       (ushort)((short)uVar266 < sVar178) * sVar178 | ((short)uVar266 >= sVar178) * uVar266;
  sVar180 = auVar252._4_2_;
  auVar332._4_2_ =
       (ushort)((short)uVar267 < sVar180) * sVar180 | ((short)uVar267 >= sVar180) * uVar267;
  sVar182 = auVar252._6_2_;
  auVar332._6_2_ =
       (ushort)((short)uVar268 < sVar182) * sVar182 | ((short)uVar268 >= sVar182) * uVar268;
  sVar186 = auVar252._8_2_;
  auVar332._8_2_ =
       (ushort)((short)uVar269 < sVar186) * sVar186 | ((short)uVar269 >= sVar186) * uVar269;
  sVar190 = auVar252._10_2_;
  auVar332._10_2_ =
       (ushort)((short)uVar270 < sVar190) * sVar190 | ((short)uVar270 >= sVar190) * uVar270;
  sVar194 = auVar252._12_2_;
  auVar332._12_2_ =
       (ushort)((short)uVar271 < sVar194) * sVar194 | ((short)uVar271 >= sVar194) * uVar271;
  sVar196 = auVar252._14_2_;
  auVar332._14_2_ =
       (ushort)((short)uVar272 < sVar196) * sVar196 | ((short)uVar272 >= sVar196) * uVar272;
  auVar225._0_2_ = -(ushort)(auVar170._0_2_ < auVar224._0_2_);
  auVar225._2_2_ = -(ushort)(auVar170._2_2_ < auVar224._2_2_);
  auVar225._4_2_ = -(ushort)(auVar170._4_2_ < auVar224._4_2_);
  auVar225._6_2_ = -(ushort)(auVar170._6_2_ < auVar224._6_2_);
  auVar225._8_2_ = -(ushort)(auVar170._8_2_ < auVar224._8_2_);
  auVar225._10_2_ = -(ushort)(auVar170._10_2_ < auVar224._10_2_);
  auVar225._12_2_ = -(ushort)(auVar170._12_2_ < auVar224._12_2_);
  auVar225._14_2_ = -(ushort)(auVar170._14_2_ < auVar224._14_2_);
  auVar171 = psubsw(auVar260,auVar292);
  auVar170 = paddsw(auVar332 & auVar225,auVar171);
  auVar170 = paddsw(auVar170,auVar171);
  auVar171 = paddsw(auVar170,auVar171);
  sVar232 = auVar171._0_2_;
  uVar258 = (ushort)(sVar198 < sVar232) * sVar198 | (ushort)(sVar198 >= sVar232) * sVar232;
  sVar232 = auVar171._2_2_;
  uVar266 = (ushort)(sVar208 < sVar232) * sVar208 | (ushort)(sVar208 >= sVar232) * sVar232;
  sVar232 = auVar171._4_2_;
  uVar267 = (ushort)(sVar209 < sVar232) * sVar209 | (ushort)(sVar209 >= sVar232) * sVar232;
  sVar232 = auVar171._6_2_;
  uVar268 = (ushort)(sVar210 < sVar232) * sVar210 | (ushort)(sVar210 >= sVar232) * sVar232;
  sVar232 = auVar171._8_2_;
  uVar269 = (ushort)(sVar213 < sVar232) * sVar213 | (ushort)(sVar213 >= sVar232) * sVar232;
  sVar232 = auVar171._10_2_;
  uVar270 = (ushort)(sVar216 < sVar232) * sVar216 | (ushort)(sVar216 >= sVar232) * sVar232;
  sVar232 = auVar171._12_2_;
  sVar238 = auVar171._14_2_;
  uVar271 = (ushort)(sVar219 < sVar232) * sVar219 | (ushort)(sVar219 >= sVar232) * sVar232;
  uVar272 = (ushort)(sVar220 < sVar238) * sVar220 | (ushort)(sVar220 >= sVar238) * sVar238;
  auVar333._0_2_ =
       (ushort)((short)uVar258 < sVar162) * sVar162 | ((short)uVar258 >= sVar162) * uVar258;
  auVar333._2_2_ =
       (ushort)((short)uVar266 < sVar178) * sVar178 | ((short)uVar266 >= sVar178) * uVar266;
  auVar333._4_2_ =
       (ushort)((short)uVar267 < sVar180) * sVar180 | ((short)uVar267 >= sVar180) * uVar267;
  auVar333._6_2_ =
       (ushort)((short)uVar268 < sVar182) * sVar182 | ((short)uVar268 >= sVar182) * uVar268;
  auVar333._8_2_ =
       (ushort)((short)uVar269 < sVar186) * sVar186 | ((short)uVar269 >= sVar186) * uVar269;
  auVar333._10_2_ =
       (ushort)((short)uVar270 < sVar190) * sVar190 | ((short)uVar270 >= sVar190) * uVar270;
  auVar333._12_2_ =
       (ushort)((short)uVar271 < sVar194) * sVar194 | ((short)uVar271 >= sVar194) * uVar271;
  auVar333._14_2_ =
       (ushort)((short)uVar272 < sVar196) * sVar196 | ((short)uVar272 >= sVar196) * uVar272;
  auVar171 = paddsw(_DAT_0050a750,auVar333 & auVar317);
  auVar170 = paddsw(auVar333 & auVar317,_DAT_00515d00);
  auVar376 = auVar376 & auVar317;
  sVar232 = auVar170._0_2_;
  uVar258 = (ushort)(sVar198 < sVar232) * sVar198 | (ushort)(sVar198 >= sVar232) * sVar232;
  sVar232 = auVar170._2_2_;
  uVar266 = (ushort)(sVar208 < sVar232) * sVar208 | (ushort)(sVar208 >= sVar232) * sVar232;
  sVar232 = auVar170._4_2_;
  uVar267 = (ushort)(sVar209 < sVar232) * sVar209 | (ushort)(sVar209 >= sVar232) * sVar232;
  sVar232 = auVar170._6_2_;
  uVar268 = (ushort)(sVar210 < sVar232) * sVar210 | (ushort)(sVar210 >= sVar232) * sVar232;
  sVar232 = auVar170._8_2_;
  uVar269 = (ushort)(sVar213 < sVar232) * sVar213 | (ushort)(sVar213 >= sVar232) * sVar232;
  sVar232 = auVar170._10_2_;
  uVar270 = (ushort)(sVar216 < sVar232) * sVar216 | (ushort)(sVar216 >= sVar232) * sVar232;
  sVar232 = auVar170._12_2_;
  sVar238 = auVar170._14_2_;
  uVar271 = (ushort)(sVar219 < sVar232) * sVar219 | (ushort)(sVar219 >= sVar232) * sVar232;
  uVar272 = (ushort)(sVar220 < sVar238) * sVar220 | (ushort)(sVar220 >= sVar238) * sVar238;
  auVar334._0_2_ =
       (ushort)((short)uVar258 < sVar162) * sVar162 | ((short)uVar258 >= sVar162) * uVar258;
  auVar334._2_2_ =
       (ushort)((short)uVar266 < sVar178) * sVar178 | ((short)uVar266 >= sVar178) * uVar266;
  auVar334._4_2_ =
       (ushort)((short)uVar267 < sVar180) * sVar180 | ((short)uVar267 >= sVar180) * uVar267;
  auVar334._6_2_ =
       (ushort)((short)uVar268 < sVar182) * sVar182 | ((short)uVar268 >= sVar182) * uVar268;
  auVar334._8_2_ =
       (ushort)((short)uVar269 < sVar186) * sVar186 | ((short)uVar269 >= sVar186) * uVar269;
  auVar334._10_2_ =
       (ushort)((short)uVar270 < sVar190) * sVar190 | ((short)uVar270 >= sVar190) * uVar270;
  auVar334._12_2_ =
       (ushort)((short)uVar271 < sVar194) * sVar194 | ((short)uVar271 >= sVar194) * uVar271;
  auVar334._14_2_ =
       (ushort)((short)uVar272 < sVar196) * sVar196 | ((short)uVar272 >= sVar196) * uVar272;
  auVar170 = psraw(auVar334,3);
  auVar252 = paddsw(auVar170,auVar292);
  sVar232 = auVar171._0_2_;
  uVar258 = (ushort)(sVar198 < sVar232) * sVar198 | (ushort)(sVar198 >= sVar232) * sVar232;
  sVar232 = auVar171._2_2_;
  uVar266 = (ushort)(sVar208 < sVar232) * sVar208 | (ushort)(sVar208 >= sVar232) * sVar232;
  sVar232 = auVar171._4_2_;
  uVar267 = (ushort)(sVar209 < sVar232) * sVar209 | (ushort)(sVar209 >= sVar232) * sVar232;
  sVar232 = auVar171._6_2_;
  uVar268 = (ushort)(sVar210 < sVar232) * sVar210 | (ushort)(sVar210 >= sVar232) * sVar232;
  sVar232 = auVar171._8_2_;
  uVar269 = (ushort)(sVar213 < sVar232) * sVar213 | (ushort)(sVar213 >= sVar232) * sVar232;
  sVar232 = auVar171._10_2_;
  uVar270 = (ushort)(sVar216 < sVar232) * sVar216 | (ushort)(sVar216 >= sVar232) * sVar232;
  sVar232 = auVar171._12_2_;
  sVar238 = auVar171._14_2_;
  uVar271 = (ushort)(sVar219 < sVar232) * sVar219 | (ushort)(sVar219 >= sVar232) * sVar232;
  uVar272 = (ushort)(sVar220 < sVar238) * sVar220 | (ushort)(sVar220 >= sVar238) * sVar238;
  auVar204._0_2_ =
       (ushort)((short)uVar258 < sVar162) * sVar162 | ((short)uVar258 >= sVar162) * uVar258;
  auVar204._2_2_ =
       (ushort)((short)uVar266 < sVar178) * sVar178 | ((short)uVar266 >= sVar178) * uVar266;
  auVar204._4_2_ =
       (ushort)((short)uVar267 < sVar180) * sVar180 | ((short)uVar267 >= sVar180) * uVar267;
  auVar204._6_2_ =
       (ushort)((short)uVar268 < sVar182) * sVar182 | ((short)uVar268 >= sVar182) * uVar268;
  auVar204._8_2_ =
       (ushort)((short)uVar269 < sVar186) * sVar186 | ((short)uVar269 >= sVar186) * uVar269;
  auVar204._10_2_ =
       (ushort)((short)uVar270 < sVar190) * sVar190 | ((short)uVar270 >= sVar190) * uVar270;
  auVar204._12_2_ =
       (ushort)((short)uVar271 < sVar194) * sVar194 | ((short)uVar271 >= sVar194) * uVar271;
  auVar204._14_2_ =
       (ushort)((short)uVar272 < sVar196) * sVar196 | ((short)uVar272 >= sVar196) * uVar272;
  auVar171 = psraw(auVar204,3);
  auVar170 = psubsw(auVar260,auVar171);
  auVar205._0_2_ = auVar171._0_2_ + 1;
  auVar205._2_2_ = auVar171._2_2_ + 1;
  auVar205._4_2_ = auVar171._4_2_ + 1;
  auVar205._6_2_ = auVar171._6_2_ + 1;
  auVar205._8_2_ = auVar171._8_2_ + 1;
  auVar205._10_2_ = auVar171._10_2_ + 1;
  auVar205._12_2_ = auVar171._12_2_ + 1;
  auVar205._14_2_ = auVar171._14_2_ + 1;
  auVar171 = psraw(auVar205,1);
  auVar253 = psubsw(auVar362,~auVar225 & auVar171);
  auVar171 = paddsw(~auVar225 & auVar171,auVar277);
  sVar232 = auVar170._0_2_;
  uVar231 = (ushort)(sVar198 < sVar232) * sVar198 | (ushort)(sVar198 >= sVar232) * sVar232;
  sVar232 = auVar170._2_2_;
  uVar237 = (ushort)(sVar208 < sVar232) * sVar208 | (ushort)(sVar208 >= sVar232) * sVar232;
  sVar232 = auVar170._4_2_;
  uVar239 = (ushort)(sVar209 < sVar232) * sVar209 | (ushort)(sVar209 >= sVar232) * sVar232;
  sVar232 = auVar170._6_2_;
  uVar241 = (ushort)(sVar210 < sVar232) * sVar210 | (ushort)(sVar210 >= sVar232) * sVar232;
  sVar232 = auVar170._8_2_;
  uVar243 = (ushort)(sVar213 < sVar232) * sVar213 | (ushort)(sVar213 >= sVar232) * sVar232;
  sVar232 = auVar170._10_2_;
  uVar245 = (ushort)(sVar216 < sVar232) * sVar216 | (ushort)(sVar216 >= sVar232) * sVar232;
  sVar232 = auVar170._12_2_;
  sVar238 = auVar170._14_2_;
  uVar247 = (ushort)(sVar219 < sVar232) * sVar219 | (ushort)(sVar219 >= sVar232) * sVar232;
  uVar249 = (ushort)(sVar220 < sVar238) * sVar220 | (ushort)(sVar220 >= sVar238) * sVar238;
  sVar232 = auVar252._0_2_;
  uVar325 = (ushort)(sVar198 < sVar232) * sVar198 | (ushort)(sVar198 >= sVar232) * sVar232;
  sVar232 = auVar252._2_2_;
  uVar338 = (ushort)(sVar208 < sVar232) * sVar208 | (ushort)(sVar208 >= sVar232) * sVar232;
  sVar232 = auVar252._4_2_;
  uVar340 = (ushort)(sVar209 < sVar232) * sVar209 | (ushort)(sVar209 >= sVar232) * sVar232;
  sVar232 = auVar252._6_2_;
  uVar341 = (ushort)(sVar210 < sVar232) * sVar210 | (ushort)(sVar210 >= sVar232) * sVar232;
  sVar232 = auVar252._8_2_;
  uVar342 = (ushort)(sVar213 < sVar232) * sVar213 | (ushort)(sVar213 >= sVar232) * sVar232;
  sVar232 = auVar252._10_2_;
  uVar343 = (ushort)(sVar216 < sVar232) * sVar216 | (ushort)(sVar216 >= sVar232) * sVar232;
  sVar232 = auVar252._12_2_;
  sVar238 = auVar252._14_2_;
  uVar344 = (ushort)(sVar219 < sVar232) * sVar219 | (ushort)(sVar219 >= sVar232) * sVar232;
  uVar345 = (ushort)(sVar220 < sVar238) * sVar220 | (ushort)(sVar220 >= sVar238) * sVar238;
  sVar232 = auVar253._0_2_;
  uVar358 = (ushort)(sVar198 < sVar232) * sVar198 | (ushort)(sVar198 >= sVar232) * sVar232;
  sVar232 = auVar253._2_2_;
  uVar364 = (ushort)(sVar208 < sVar232) * sVar208 | (ushort)(sVar208 >= sVar232) * sVar232;
  sVar232 = auVar253._4_2_;
  uVar365 = (ushort)(sVar209 < sVar232) * sVar209 | (ushort)(sVar209 >= sVar232) * sVar232;
  sVar232 = auVar253._6_2_;
  uVar366 = (ushort)(sVar210 < sVar232) * sVar210 | (ushort)(sVar210 >= sVar232) * sVar232;
  sVar232 = auVar253._8_2_;
  uVar368 = (ushort)(sVar213 < sVar232) * sVar213 | (ushort)(sVar213 >= sVar232) * sVar232;
  sVar232 = auVar253._10_2_;
  uVar370 = (ushort)(sVar216 < sVar232) * sVar216 | (ushort)(sVar216 >= sVar232) * sVar232;
  sVar232 = auVar253._12_2_;
  sVar238 = auVar253._14_2_;
  uVar372 = (ushort)(sVar219 < sVar232) * sVar219 | (ushort)(sVar219 >= sVar232) * sVar232;
  uVar373 = (ushort)(sVar220 < sVar238) * sVar220 | (ushort)(sVar220 >= sVar238) * sVar238;
  sVar232 = auVar171._0_2_;
  uVar258 = (ushort)(sVar198 < sVar232) * sVar198 | (ushort)(sVar198 >= sVar232) * sVar232;
  sVar198 = auVar171._2_2_;
  uVar266 = (ushort)(sVar208 < sVar198) * sVar208 | (ushort)(sVar208 >= sVar198) * sVar198;
  sVar198 = auVar171._4_2_;
  uVar267 = (ushort)(sVar209 < sVar198) * sVar209 | (ushort)(sVar209 >= sVar198) * sVar198;
  sVar198 = auVar171._6_2_;
  uVar268 = (ushort)(sVar210 < sVar198) * sVar210 | (ushort)(sVar210 >= sVar198) * sVar198;
  sVar198 = auVar171._8_2_;
  uVar269 = (ushort)(sVar213 < sVar198) * sVar213 | (ushort)(sVar213 >= sVar198) * sVar198;
  sVar198 = auVar171._10_2_;
  uVar270 = (ushort)(sVar216 < sVar198) * sVar216 | (ushort)(sVar216 >= sVar198) * sVar198;
  sVar198 = auVar171._12_2_;
  sVar208 = auVar171._14_2_;
  uVar271 = (ushort)(sVar219 < sVar198) * sVar219 | (ushort)(sVar219 >= sVar198) * sVar198;
  uVar272 = (ushort)(sVar220 < sVar208) * sVar220 | (ushort)(sVar220 >= sVar208) * sVar208;
  auVar234._0_2_ =
       (ushort)((short)uVar231 < sVar162) * sVar162 | ((short)uVar231 >= sVar162) * uVar231;
  auVar234._2_2_ =
       (ushort)((short)uVar237 < sVar178) * sVar178 | ((short)uVar237 >= sVar178) * uVar237;
  auVar234._4_2_ =
       (ushort)((short)uVar239 < sVar180) * sVar180 | ((short)uVar239 >= sVar180) * uVar239;
  auVar234._6_2_ =
       (ushort)((short)uVar241 < sVar182) * sVar182 | ((short)uVar241 >= sVar182) * uVar241;
  auVar234._8_2_ =
       (ushort)((short)uVar243 < sVar186) * sVar186 | ((short)uVar243 >= sVar186) * uVar243;
  auVar234._10_2_ =
       (ushort)((short)uVar245 < sVar190) * sVar190 | ((short)uVar245 >= sVar190) * uVar245;
  auVar234._12_2_ =
       (ushort)((short)uVar247 < sVar194) * sVar194 | ((short)uVar247 >= sVar194) * uVar247;
  auVar234._14_2_ =
       (ushort)((short)uVar249 < sVar196) * sVar196 | ((short)uVar249 >= sVar196) * uVar249;
  auVar335._0_2_ =
       (ushort)((short)uVar325 < sVar162) * sVar162 | ((short)uVar325 >= sVar162) * uVar325;
  auVar335._2_2_ =
       (ushort)((short)uVar338 < sVar178) * sVar178 | ((short)uVar338 >= sVar178) * uVar338;
  auVar335._4_2_ =
       (ushort)((short)uVar340 < sVar180) * sVar180 | ((short)uVar340 >= sVar180) * uVar340;
  auVar335._6_2_ =
       (ushort)((short)uVar341 < sVar182) * sVar182 | ((short)uVar341 >= sVar182) * uVar341;
  auVar335._8_2_ =
       (ushort)((short)uVar342 < sVar186) * sVar186 | ((short)uVar342 >= sVar186) * uVar342;
  auVar335._10_2_ =
       (ushort)((short)uVar343 < sVar190) * sVar190 | ((short)uVar343 >= sVar190) * uVar343;
  auVar335._12_2_ =
       (ushort)((short)uVar344 < sVar194) * sVar194 | ((short)uVar344 >= sVar194) * uVar344;
  auVar335._14_2_ =
       (ushort)((short)uVar345 < sVar196) * sVar196 | ((short)uVar345 >= sVar196) * uVar345;
  auVar363._0_2_ =
       (ushort)((short)uVar358 < sVar162) * sVar162 | ((short)uVar358 >= sVar162) * uVar358;
  auVar363._2_2_ =
       (ushort)((short)uVar364 < sVar178) * sVar178 | ((short)uVar364 >= sVar178) * uVar364;
  auVar363._4_2_ =
       (ushort)((short)uVar365 < sVar180) * sVar180 | ((short)uVar365 >= sVar180) * uVar365;
  auVar363._6_2_ =
       (ushort)((short)uVar366 < sVar182) * sVar182 | ((short)uVar366 >= sVar182) * uVar366;
  auVar363._8_2_ =
       (ushort)((short)uVar368 < sVar186) * sVar186 | ((short)uVar368 >= sVar186) * uVar368;
  auVar363._10_2_ =
       (ushort)((short)uVar370 < sVar190) * sVar190 | ((short)uVar370 >= sVar190) * uVar370;
  auVar363._12_2_ =
       (ushort)((short)uVar372 < sVar194) * sVar194 | ((short)uVar372 >= sVar194) * uVar372;
  auVar363._14_2_ =
       (ushort)((short)uVar373 < sVar196) * sVar196 | ((short)uVar373 >= sVar196) * uVar373;
  auVar226._0_2_ =
       (ushort)((short)uVar258 < sVar162) * sVar162 | ((short)uVar258 >= sVar162) * uVar258;
  auVar226._2_2_ =
       (ushort)((short)uVar266 < sVar178) * sVar178 | ((short)uVar266 >= sVar178) * uVar266;
  auVar226._4_2_ =
       (ushort)((short)uVar267 < sVar180) * sVar180 | ((short)uVar267 >= sVar180) * uVar267;
  auVar226._6_2_ =
       (ushort)((short)uVar268 < sVar182) * sVar182 | ((short)uVar268 >= sVar182) * uVar268;
  auVar226._8_2_ =
       (ushort)((short)uVar269 < sVar186) * sVar186 | ((short)uVar269 >= sVar186) * uVar269;
  auVar226._10_2_ =
       (ushort)((short)uVar270 < sVar190) * sVar190 | ((short)uVar270 >= sVar190) * uVar270;
  auVar226._12_2_ =
       (ushort)((short)uVar271 < sVar194) * sVar194 | ((short)uVar271 >= sVar194) * uVar271;
  auVar226._14_2_ =
       (ushort)((short)uVar272 < sVar196) * sVar196 | ((short)uVar272 >= sVar196) * uVar272;
  local_288 = paddsw(auVar234,auVar350);
  local_268 = paddsw(auVar335,auVar350);
  local_298 = paddsw(auVar363,auVar350);
  local_278 = paddsw(auVar226,auVar350);
  if ((((((((((((((((auVar376 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar376 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar376 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar376 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar376 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar376 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar376 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar376 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar376 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar376 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar376 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar376 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar376 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar376 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar376 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar376[0xf]) {
    auVar384._4_2_ = sVar185;
    auVar384._0_4_ = local_1a8;
    auVar384._6_2_ = uVar89;
    auVar384._8_2_ = sVar367;
    auVar384._10_2_ = uVar94;
    auVar384._12_2_ = sVar212;
    auVar384._14_2_ = uVar100;
  }
  else {
    auVar171 = psubusw(auVar382,auVar280);
    sVar232 = sVar230 + sVar229 + sVar181;
    sVar238 = uVar56 + uVar55 + uVar57;
    sVar240 = sVar192 + sVar188 + sVar163;
    sVar242 = uVar63 + uVar62 + uVar64;
    sVar244 = sVar217 + sVar214 + sVar179;
    sVar246 = uVar70 + uVar69 + uVar71;
    sVar248 = sVar257 + sVar256 + sVar183;
    sVar250 = uVar77 + uVar76 + uVar78;
    sVar198 = sVar309 + local_388 + sVar195;
    sVar208 = uVar80 + uStack_386 + uVar79;
    sVar209 = sVar286 + sStack_384 + sVar187;
    sVar210 = uVar87 + uStack_382 + uVar86;
    sVar213 = sVar295 + sStack_380 + sVar191;
    sVar216 = uVar93 + uStack_37e + uVar92;
    sVar219 = sVar337 + sStack_37c + sVar197;
    sVar220 = uVar99 + uStack_37a + uVar98;
    sVar162 = sVar198 + sVar232 + 4;
    sVar178 = sVar208 + sVar238 + 4;
    sVar180 = sVar209 + sVar240 + 4;
    sVar182 = sVar210 + sVar242 + 4;
    sVar186 = sVar213 + sVar244 + 4;
    sVar190 = sVar216 + sVar246 + 4;
    sVar194 = sVar219 + sVar248 + 4;
    sVar196 = sVar220 + sVar250 + 4;
    auVar383._0_2_ = -(ushort)(auVar171._0_2_ == 0);
    auVar383._2_2_ = -(ushort)(auVar171._2_2_ == 0);
    auVar383._4_2_ = -(ushort)(auVar171._4_2_ == 0);
    auVar383._6_2_ = -(ushort)(auVar171._6_2_ == 0);
    auVar383._8_2_ = -(ushort)(auVar171._8_2_ == 0);
    auVar383._10_2_ = -(ushort)(auVar171._10_2_ == 0);
    auVar383._12_2_ = -(ushort)(auVar171._12_2_ == 0);
    auVar383._14_2_ = -(ushort)(auVar171._14_2_ == 0);
    local_2a8 = (ushort)(sVar181 + sVar228 + sVar162) >> 3;
    uStack_2a6 = (ushort)(uVar57 + uVar54 + sVar178) >> 3;
    uStack_2a4 = (ushort)(sVar163 + sVar184 + sVar180) >> 3;
    uStack_2a2 = (ushort)(uVar64 + uVar61 + sVar182) >> 3;
    uStack_2a0 = (ushort)(sVar179 + sVar211 + sVar186) >> 3;
    uStack_29e = (ushort)(uVar71 + uVar68 + sVar190) >> 3;
    uStack_29c = (ushort)(sVar183 + sVar255 + sVar194) >> 3;
    uStack_29a = (ushort)(uVar78 + uVar75 + sVar196) >> 3;
    local_2c8 = (ushort)(sVar195 + (short)local_398 + sVar162) >> 3;
    uStack_2c6 = (ushort)(uVar79 + local_398._2_2_ + sVar178) >> 3;
    uStack_2c4 = (ushort)(sVar187 + local_398._4_2_ + sVar180) >> 3;
    uStack_2c2 = (ushort)(uVar86 + local_398._6_2_ + sVar182) >> 3;
    uStack_2c0 = (ushort)(sVar191 + sVar311 + sVar186) >> 3;
    uStack_2be = (ushort)(uVar92 + uVar81 + sVar190) >> 3;
    uStack_2bc = (ushort)(sVar197 + sVar287 + sVar194) >> 3;
    uStack_2ba = (ushort)(uVar98 + uVar88 + sVar196) >> 3;
    local_2b8 = (ushort)(sVar230 + sVar228 * 2 + (sVar162 - local_388)) >> 3;
    uStack_2b6 = (ushort)(uVar56 + uVar54 * 2 + (sVar178 - uStack_386)) >> 3;
    uStack_2b4 = (ushort)(sVar192 + sVar184 * 2 + (sVar180 - sStack_384)) >> 3;
    uStack_2b2 = (ushort)(uVar63 + uVar61 * 2 + (sVar182 - uStack_382)) >> 3;
    uStack_2b0 = (ushort)(sVar217 + sVar211 * 2 + (sVar186 - sStack_380)) >> 3;
    uStack_2ae = (ushort)(uVar70 + uVar68 * 2 + (sVar190 - uStack_37e)) >> 3;
    uStack_2ac = (ushort)(sVar257 + sVar255 * 2 + (sVar194 - sStack_37c)) >> 3;
    uStack_2aa = (ushort)(uVar77 + uVar75 * 2 + (sVar196 - uStack_37a)) >> 3;
    local_2d8 = (ushort)((short)local_398 * 2 + sVar309 + (sVar162 - sVar229)) >> 3;
    uStack_2d6 = (ushort)(local_398._2_2_ * 2 + uVar80 + (sVar178 - uVar55)) >> 3;
    uStack_2d4 = (ushort)(local_398._4_2_ * 2 + sVar286 + (sVar180 - sVar188)) >> 3;
    uStack_2d2 = (ushort)(local_398._6_2_ * 2 + uVar87 + (sVar182 - uVar62)) >> 3;
    uStack_2d0 = (ushort)(sVar311 * 2 + sVar295 + (sVar186 - sVar214)) >> 3;
    uStack_2ce = (ushort)(uVar81 * 2 + uVar93 + (sVar190 - uVar69)) >> 3;
    uStack_2cc = (ushort)(sVar287 * 2 + sVar337 + (sVar194 - sVar256)) >> 3;
    uStack_2ca = (ushort)(uVar88 * 2 + uVar99 + (sVar196 - uVar76)) >> 3;
    auVar383 = auVar383 & auVar376;
    if ((((((((((((((((auVar383 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar383 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar383 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar383 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar383 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar383 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar383 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar383 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar383 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar383 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar383 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar383 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar383 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar383 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar383 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar383[0xf] < '\0'
       ) {
      auVar108._8_8_ = auVar360._8_8_;
      auVar108._0_8_ = local_1f8;
      auVar170 = psllw(auVar108,2);
      sVar232 = sVar310 + sVar228 + (short)local_398 + sVar387 + sVar198 + local_218 + sVar386 +
                sVar232 + 8;
      sVar238 = uVar53 + uVar54 + local_398._2_2_ + uVar83 + sVar208 + sStack_216 + uVar82 + sVar238
                + 8;
      sVar240 = sVar324 + sVar184 + local_398._4_2_ + sVar189 + sVar209 + sStack_214 + sVar185 +
                sVar240 + 8;
      sVar242 = uVar60 + uVar61 + local_398._6_2_ + uVar90 + sVar210 + sStack_212 + uVar89 + sVar242
                + 8;
      sVar244 = sVar339 + sVar211 + sVar311 + sVar369 + sVar213 + sStack_210 + sVar367 + sVar244 + 8
      ;
      sVar246 = uVar67 + uVar68 + uVar81 + uVar95 + sVar216 + uStack_20e + uVar94 + sVar246 + 8;
      sVar248 = sVar355 + sVar255 + sVar287 + sVar215 + sVar219 + sStack_20c + sVar212 + sVar248 + 8
      ;
      sVar250 = uVar74 + uVar75 + uVar88 + uVar101 + sVar220 + uStack_20a + uVar100 + sVar250 + 8;
      local_98 = (ushort)(sVar308 + sVar195 + sVar230 + sVar181 + sVar232) >> 4;
      uStack_96 = (ushort)(uVar52 + uVar79 + uVar56 + uVar57 + sVar238) >> 4;
      uStack_94 = (ushort)(sVar323 + sVar187 + sVar192 + sVar163 + sVar240) >> 4;
      uStack_92 = (ushort)(uVar59 + uVar86 + uVar63 + uVar64 + sVar242) >> 4;
      uStack_90 = (ushort)(sVar336 + sVar191 + sVar217 + sVar179 + sVar244) >> 4;
      uStack_8e = (ushort)(uVar66 + uVar92 + uVar70 + uVar71 + sVar246) >> 4;
      uStack_8c = (ushort)(sVar354 + sVar197 + sVar257 + sVar183 + sVar248) >> 4;
      uStack_8a = (ushort)(uVar73 + uVar98 + uVar77 + uVar78 + sVar250) >> 4;
      local_f8 = (ushort)(sVar195 + sVar309 + sVar388 + sVar181 + sVar232) >> 4;
      uStack_f6 = (ushort)(uVar79 + uVar80 + uVar84 + uVar57 + sVar238) >> 4;
      uStack_f4 = (ushort)(sVar187 + sVar286 + sVar193 + sVar163 + sVar240) >> 4;
      uStack_f2 = (ushort)(uVar86 + uVar87 + uVar91 + uVar64 + sVar242) >> 4;
      uStack_f0 = (ushort)(sVar191 + sVar295 + sVar371 + sVar179 + sVar244) >> 4;
      uStack_ee = (ushort)(uVar92 + uVar93 + uVar96 + uVar71 + sVar246) >> 4;
      uStack_ec = (ushort)(sVar197 + sVar337 + sVar218 + sVar183 + sVar248) >> 4;
      uStack_ea = (ushort)(uVar98 + uVar99 + uVar102 + uVar78 + sVar250) >> 4;
      local_88 = (ushort)(sVar308 * 2 + sVar229 + sVar181 + sVar230 + (sVar232 - sVar387)) >> 4;
      uStack_86 = (ushort)(uVar52 * 2 + uVar55 + uVar57 + uVar56 + (sVar238 - uVar83)) >> 4;
      uStack_84 = (ushort)(sVar323 * 2 + sVar188 + sVar163 + sVar192 + (sVar240 - sVar189)) >> 4;
      uStack_82 = (ushort)(uVar59 * 2 + uVar62 + uVar64 + uVar63 + (sVar242 - uVar90)) >> 4;
      uStack_80 = (ushort)(sVar336 * 2 + sVar214 + sVar179 + sVar217 + (sVar244 - sVar369)) >> 4;
      uStack_7e = (ushort)(uVar66 * 2 + uVar69 + uVar71 + uVar70 + (sVar246 - uVar95)) >> 4;
      uStack_7c = (ushort)(sVar354 * 2 + sVar256 + sVar183 + sVar257 + (sVar248 - sVar215)) >> 4;
      uStack_7a = (ushort)(uVar73 * 2 + uVar76 + uVar78 + uVar77 + (sVar250 - uVar101)) >> 4;
      local_e8 = (ushort)(sVar388 * 2 + local_388 + sVar195 + sVar309 + (sVar232 - sVar310)) >> 4;
      uStack_e6 = (ushort)(uVar84 * 2 + uStack_386 + uVar79 + uVar80 + (sVar238 - uVar53)) >> 4;
      uStack_e4 = (ushort)(sVar193 * 2 + sStack_384 + sVar187 + sVar286 + (sVar240 - sVar324)) >> 4;
      uStack_e2 = (ushort)(uVar91 * 2 + uStack_382 + uVar86 + uVar87 + (sVar242 - uVar60)) >> 4;
      uStack_e0 = (ushort)(sVar371 * 2 + sStack_380 + sVar191 + sVar295 + (sVar244 - sVar339)) >> 4;
      uStack_de = (ushort)(uVar96 * 2 + uStack_37e + uVar92 + uVar93 + (sVar246 - uVar67)) >> 4;
      uStack_dc = (ushort)(sVar218 * 2 + sStack_37c + sVar197 + sVar337 + (sVar248 - sVar355)) >> 4;
      uStack_da = (ushort)(uVar102 * 2 + uStack_37a + uVar98 + uVar99 + (sVar250 - uVar74)) >> 4;
      sVar198 = (sVar232 - sVar387) - sVar386;
      sVar208 = (sVar238 - uVar83) - uVar82;
      sVar209 = (sVar240 - sVar189) - sVar185;
      sVar210 = (sVar242 - uVar90) - uVar89;
      sVar213 = (sVar244 - sVar369) - sVar367;
      sVar216 = (sVar246 - uVar95) - uVar94;
      sVar219 = (sVar248 - sVar215) - sVar212;
      sVar220 = (sVar250 - uVar101) - uVar100;
      local_78 = (ushort)(sVar308 * 3 + sVar229 + sVar228 + sVar230 + sVar198) >> 4;
      uStack_76 = (ushort)(uVar52 * 3 + uVar55 + uVar54 + uVar56 + sVar208) >> 4;
      uStack_74 = (ushort)(sVar323 * 3 + sVar188 + sVar184 + sVar192 + sVar209) >> 4;
      uStack_72 = (ushort)(uVar59 * 3 + uVar62 + uVar61 + uVar63 + sVar210) >> 4;
      uStack_70 = (ushort)(sVar336 * 3 + sVar214 + sVar211 + sVar217 + sVar213) >> 4;
      uStack_6e = (ushort)(uVar66 * 3 + uVar69 + uVar68 + uVar70 + sVar216) >> 4;
      uStack_6c = (ushort)(sVar354 * 3 + sVar256 + sVar255 + sVar257 + sVar219) >> 4;
      uStack_6a = (ushort)(uVar73 * 3 + uVar76 + uVar75 + uVar77 + sVar220) >> 4;
      sVar163 = (sVar232 - sVar310) - local_218;
      sVar179 = (sVar238 - uVar53) - sStack_216;
      sVar181 = (sVar240 - sVar324) - sStack_214;
      sVar183 = (sVar242 - uVar60) - sStack_212;
      sVar187 = (sVar244 - sVar339) - sStack_210;
      sVar191 = (sVar246 - uVar67) - uStack_20e;
      sVar195 = (sVar248 - sVar355) - sStack_20c;
      sVar197 = (sVar250 - uVar74) - uStack_20a;
      local_d8 = (ushort)(local_388 + (short)local_398 + sVar309 + sVar388 * 3 + sVar163) >> 4;
      uStack_d6 = (ushort)(uStack_386 + local_398._2_2_ + uVar80 + uVar84 * 3 + sVar179) >> 4;
      uStack_d4 = (ushort)(sStack_384 + local_398._4_2_ + sVar286 + sVar193 * 3 + sVar181) >> 4;
      uStack_d2 = (ushort)(uStack_382 + local_398._6_2_ + uVar87 + uVar91 * 3 + sVar183) >> 4;
      uStack_d0 = (ushort)(sStack_380 + sVar311 + sVar295 + sVar371 * 3 + sVar187) >> 4;
      uStack_ce = (ushort)(uStack_37e + uVar81 + uVar93 + uVar96 * 3 + sVar191) >> 4;
      uStack_cc = (ushort)(sStack_37c + sVar287 + sVar337 + sVar218 * 3 + sVar195) >> 4;
      uStack_ca = (ushort)(uStack_37a + uVar88 + uVar99 + uVar102 * 3 + sVar197) >> 4;
      sVar198 = sVar198 - (short)local_398;
      sVar208 = sVar208 - local_398._2_2_;
      sVar209 = sVar209 - local_398._4_2_;
      sVar210 = sVar210 - local_398._6_2_;
      sVar213 = sVar213 - sVar311;
      sVar216 = sVar216 - uVar81;
      sVar219 = sVar219 - sVar287;
      sVar220 = sVar220 - uVar88;
      sVar163 = sVar163 - sVar228;
      sVar179 = sVar179 - uVar54;
      sVar181 = sVar181 - sVar184;
      sVar183 = sVar183 - uVar61;
      sVar187 = sVar187 - sVar211;
      sVar191 = sVar191 - uVar68;
      sVar195 = sVar195 - sVar255;
      sVar197 = sVar197 - uVar75;
      local_68 = (ushort)(sVar229 + sVar228 + auVar170._0_2_ + local_218 + sVar198) >> 4;
      uStack_66 = (ushort)(uVar55 + uVar54 + auVar170._2_2_ + sStack_216 + sVar208) >> 4;
      uStack_64 = (ushort)(sVar188 + sVar184 + auVar170._4_2_ + sStack_214 + sVar209) >> 4;
      uStack_62 = (ushort)(uVar62 + uVar61 + auVar170._6_2_ + sStack_212 + sVar210) >> 4;
      uStack_60 = (ushort)(sVar214 + sVar211 + auVar170._8_2_ + sStack_210 + sVar213) >> 4;
      uStack_5e = (ushort)(uVar69 + uVar68 + auVar170._10_2_ + uStack_20e + sVar216) >> 4;
      uStack_5c = (ushort)(sVar256 + sVar255 + auVar170._12_2_ + sStack_20c + sVar219) >> 4;
      uStack_5a = (ushort)(uVar76 + uVar75 + auVar170._14_2_ + uStack_20a + sVar220) >> 4;
      auVar105._4_2_ = sVar193;
      auVar105._0_4_ = auVar380._8_4_;
      auVar105._6_2_ = uVar91;
      auVar105._8_2_ = sVar371;
      auVar105._10_2_ = uVar96;
      auVar105._12_2_ = sVar218;
      auVar105._14_2_ = uVar102;
      auVar171 = psllw(auVar105,2);
      local_c8 = (ushort)(local_388 + (short)local_398 + auVar171._0_2_ + sVar386 + sVar163) >> 4;
      uStack_c6 = (ushort)(uStack_386 + local_398._2_2_ + auVar171._2_2_ + uVar82 + sVar179) >> 4;
      uStack_c4 = (ushort)(sStack_384 + local_398._4_2_ + auVar171._4_2_ + sVar185 + sVar181) >> 4;
      uStack_c2 = (ushort)(uStack_382 + local_398._6_2_ + auVar171._6_2_ + uVar89 + sVar183) >> 4;
      uStack_c0 = (ushort)(sStack_380 + sVar311 + auVar171._8_2_ + sVar367 + sVar187) >> 4;
      uStack_be = (ushort)(uStack_37e + uVar81 + auVar171._10_2_ + uVar94 + sVar191) >> 4;
      uStack_bc = (ushort)(sStack_37c + sVar287 + auVar171._12_2_ + sVar212 + sVar195) >> 4;
      uStack_ba = (ushort)(uStack_37a + uVar88 + auVar171._14_2_ + uVar100 + sVar197) >> 4;
      sVar198 = sVar198 - local_388;
      sVar208 = sVar208 - uStack_386;
      sVar209 = sVar209 - sStack_384;
      sVar210 = sVar210 - uStack_382;
      sVar213 = sVar213 - sStack_380;
      sVar216 = sVar216 - uStack_37e;
      sVar219 = sVar219 - sStack_37c;
      sVar220 = sVar220 - uStack_37a;
      sVar163 = sVar163 - sVar229;
      sVar179 = sVar179 - uVar55;
      sVar181 = sVar181 - sVar188;
      sVar183 = sVar183 - uVar62;
      sVar187 = sVar187 - sVar214;
      sVar191 = sVar191 - uVar69;
      sVar195 = sVar195 - sVar256;
      sVar197 = sVar197 - uVar76;
      local_58 = (ushort)(auVar170._0_2_ + sVar308 + sVar310 + sVar228 + local_218 + sVar198) >> 4;
      uStack_56 = (ushort)(auVar170._2_2_ + uVar52 + uVar53 + uVar54 + sStack_216 + sVar208) >> 4;
      uStack_54 = (ushort)(auVar170._4_2_ + sVar323 + sVar324 + sVar184 + sStack_214 + sVar209) >> 4
      ;
      uStack_52 = (ushort)(auVar170._6_2_ + uVar59 + uVar60 + uVar61 + sStack_212 + sVar210) >> 4;
      uStack_50 = (ushort)(auVar170._8_2_ + sVar336 + sVar339 + sVar211 + sStack_210 + sVar213) >> 4
      ;
      uStack_4e = (ushort)(auVar170._10_2_ + uVar66 + uVar67 + uVar68 + uStack_20e + sVar216) >> 4;
      uStack_4c = (ushort)(auVar170._12_2_ + sVar354 + sVar355 + sVar255 + sStack_20c + sVar219) >>
                  4;
      uStack_4a = (ushort)(auVar170._14_2_ + uVar73 + uVar74 + uVar75 + uStack_20a + sVar220) >> 4;
      local_b8 = (ushort)((short)local_398 + sVar387 + sVar386 + auVar171._0_2_ + sVar388 + sVar163)
                 >> 4;
      uStack_b6 = (ushort)(local_398._2_2_ + uVar83 + uVar82 + auVar171._2_2_ + uVar84 + sVar179) >>
                  4;
      uStack_b4 = (ushort)(local_398._4_2_ + sVar189 + sVar185 + auVar171._4_2_ + sVar193 + sVar181)
                  >> 4;
      uStack_b2 = (ushort)(local_398._6_2_ + uVar90 + uVar89 + auVar171._6_2_ + uVar91 + sVar183) >>
                  4;
      uStack_b0 = (ushort)(sVar311 + sVar369 + sVar367 + auVar171._8_2_ + sVar371 + sVar187) >> 4;
      uStack_ae = (ushort)(uVar81 + uVar95 + uVar94 + auVar171._10_2_ + uVar96 + sVar191) >> 4;
      uStack_ac = (ushort)(sVar287 + sVar215 + sVar212 + auVar171._12_2_ + sVar218 + sVar195) >> 4;
      uStack_aa = (ushort)(uVar88 + uVar101 + uVar100 + auVar171._14_2_ + uVar102 + sVar197) >> 4;
      local_48 = (ushort)(((sVar310 + sVar308 * 7) - sVar309) + local_218 + sVar198) >> 4;
      uStack_46 = (ushort)(((uVar53 + uVar52 * 7) - uVar80) + sStack_216 + sVar208) >> 4;
      uStack_44 = (ushort)(((sVar324 + sVar323 * 7) - sVar286) + sStack_214 + sVar209) >> 4;
      uStack_42 = (ushort)(((uVar60 + uVar59 * 7) - uVar87) + sStack_212 + sVar210) >> 4;
      uStack_40 = (ushort)(((sVar339 + sVar336 * 7) - sVar295) + sStack_210 + sVar213) >> 4;
      uStack_3e = (ushort)(((uVar67 + uVar66 * 7) - uVar93) + uStack_20e + sVar216) >> 4;
      uStack_3c = (ushort)(((sVar355 + sVar354 * 7) - sVar337) + sStack_20c + sVar219) >> 4;
      uStack_3a = (ushort)(((uVar74 + uVar73 * 7) - uVar99) + uStack_20a + sVar220) >> 4;
      local_a8 = (ushort)(((sVar387 + sVar388 * 7) - sVar230) + sVar386 + sVar163) >> 4;
      uStack_a6 = (ushort)(((uVar83 + uVar84 * 7) - uVar56) + uVar82 + sVar179) >> 4;
      uStack_a4 = (ushort)(((sVar189 + sVar193 * 7) - sVar192) + sVar185 + sVar181) >> 4;
      uStack_a2 = (ushort)(((uVar90 + uVar91 * 7) - uVar63) + uVar89 + sVar183) >> 4;
      uStack_a0 = (ushort)(((sVar369 + sVar371 * 7) - sVar217) + sVar367 + sVar187) >> 4;
      uStack_9e = (ushort)(((uVar95 + uVar96 * 7) - uVar70) + uVar94 + sVar191) >> 4;
      uStack_9c = (ushort)(((sVar215 + sVar218 * 7) - sVar257) + sVar212 + sVar195) >> 4;
      uStack_9a = (ushort)(((uVar101 + uVar102 * 7) - uVar77) + uVar100 + sVar197) >> 4;
    }
    auVar305._0_2_ = (ushort)(((sVar228 * 3 + sVar229) - sVar309) + (sVar162 - local_388)) >> 3;
    auVar305._2_2_ = (ushort)(((uVar54 * 3 + uVar55) - uVar80) + (sVar178 - uStack_386)) >> 3;
    auVar305._4_2_ = (ushort)(((sVar184 * 3 + sVar188) - sVar286) + (sVar180 - sStack_384)) >> 3;
    auVar305._6_2_ = (ushort)(((uVar61 * 3 + uVar62) - uVar87) + (sVar182 - uStack_382)) >> 3;
    auVar305._8_2_ = (ushort)(((sVar211 * 3 + sVar214) - sVar295) + (sVar186 - sStack_380)) >> 3;
    auVar305._10_2_ = (ushort)(((uVar68 * 3 + uVar69) - uVar93) + (sVar190 - uStack_37e)) >> 3;
    auVar305._12_2_ = (ushort)(((sVar255 * 3 + sVar256) - sVar337) + (sVar194 - sStack_37c)) >> 3;
    auVar305._14_2_ = (ushort)(((uVar75 * 3 + uVar76) - uVar99) + (sVar196 - uStack_37a)) >> 3;
    auVar235._0_2_ =
         (ushort)((((short)local_398 * 3 + local_388) - sVar230) + (sVar162 - sVar229)) >> 3;
    auVar235._2_2_ =
         (ushort)(((local_398._2_2_ * 3 + uStack_386) - uVar56) + (sVar178 - uVar55)) >> 3;
    auVar235._4_2_ =
         (ushort)(((local_398._4_2_ * 3 + sStack_384) - sVar192) + (sVar180 - sVar188)) >> 3;
    auVar235._6_2_ =
         (ushort)(((local_398._6_2_ * 3 + uStack_382) - uVar63) + (sVar182 - uVar62)) >> 3;
    auVar235._8_2_ = (ushort)(((sVar311 * 3 + sStack_380) - sVar217) + (sVar186 - sVar214)) >> 3;
    auVar235._10_2_ = (ushort)(((uVar81 * 3 + uStack_37e) - uVar70) + (sVar190 - uVar69)) >> 3;
    auVar235._12_2_ = (ushort)(((sVar287 * 3 + sStack_37c) - sVar257) + (sVar194 - sVar256)) >> 3;
    auVar235._14_2_ = (ushort)(((uVar88 * 3 + uStack_37a) - uVar77) + (sVar196 - uVar76)) >> 3;
    auVar172._8_4_ = 0xffffffff;
    auVar172._0_8_ = 0xffffffffffffffff;
    auVar172._12_4_ = 0xffffffff;
    auVar172 = auVar172 ^ auVar376;
    pauVar149 = &local_268;
    pauVar150 = &local_1e8;
    pauVar152 = (undefined1 (*) [16])&local_2c8;
    pauVar154 = (undefined1 (*) [16])&local_2a8;
    pauVar156 = &local_288;
    pauVar158 = &local_258;
    bVar147 = true;
    do {
      bVar155 = bVar147;
      auVar171 = *pauVar149;
      *pauVar149 = auVar171 & auVar172;
      auVar170 = *pauVar154;
      *pauVar154 = auVar170 & auVar376;
      *pauVar158 = auVar170 & auVar376 | auVar171 & auVar172;
      auVar171 = *pauVar156;
      *pauVar156 = auVar171 & auVar172;
      auVar170 = *pauVar152;
      *pauVar152 = auVar170 & auVar376;
      *pauVar150 = auVar170 & auVar376 | auVar171 & auVar172;
      pauVar149 = &local_278;
      pauVar150 = &local_1d8;
      pauVar152 = (undefined1 (*) [16])&local_2d8;
      pauVar154 = (undefined1 (*) [16])&local_2b8;
      pauVar156 = &local_298;
      pauVar158 = &local_248;
      bVar147 = false;
    } while (bVar155);
    local_238 = ~auVar376 & local_238 | auVar305 & auVar376;
    local_1c8 = ~auVar376 & local_1c8 | auVar235 & auVar376;
    pauVar149 = (undefined1 (*) [16])&local_2a8;
    pauVar150 = &local_1e8;
    pauVar152 = (undefined1 (*) [16])&local_2c8;
    pauVar154 = &local_268;
    pauVar156 = &local_258;
    pauVar158 = &local_288;
    bVar147 = true;
    do {
      bVar155 = bVar147;
      auVar171 = *pauVar154;
      *pauVar154 = auVar171 & auVar172;
      auVar170 = *pauVar149;
      *pauVar149 = auVar170 & auVar376;
      *pauVar156 = auVar170 & auVar376 | auVar171 & auVar172;
      auVar171 = *pauVar158;
      *pauVar158 = auVar171 & auVar172;
      auVar170 = *pauVar152;
      *pauVar152 = auVar170 & auVar376;
      *pauVar150 = auVar170 & auVar376 | auVar171 & auVar172;
      pauVar149 = (undefined1 (*) [16])&local_2b8;
      pauVar150 = &local_1d8;
      pauVar152 = (undefined1 (*) [16])&local_2d8;
      pauVar154 = &local_278;
      pauVar156 = &local_248;
      pauVar158 = &local_298;
      bVar147 = false;
    } while (bVar155);
    if ((((((((((((((((auVar383 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar383 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar383 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar383 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar383 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar383 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar383 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar383 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar383 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar383 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar383 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar383 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar383 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar383 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar383 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar383[0xf] < '\0'
       ) {
      lVar148 = 0;
      do {
        auVar171 = *(undefined1 (*) [16])((long)&local_98 + lVar148) & auVar383;
        *(undefined1 (*) [16])((long)&local_98 + lVar148) = auVar171;
        *(undefined1 (*) [16])(local_258 + lVar148) =
             ~auVar383 & *(undefined1 (*) [16])(local_258 + lVar148) | auVar171;
        auVar171 = *(undefined1 (*) [16])((long)&local_f8 + lVar148) & auVar383;
        *(undefined1 (*) [16])((long)&local_f8 + lVar148) = auVar171;
        *(undefined1 (*) [16])(local_1e8 + lVar148) =
             ~auVar383 & *(undefined1 (*) [16])(local_1e8 + lVar148) | auVar171;
        lVar148 = lVar148 + 0x10;
      } while (lVar148 != 0x60);
    }
    local_278._8_8_ = local_248._8_8_;
    local_278._0_8_ = local_248._0_8_;
    local_388 = local_1c8._0_2_;
    uStack_386 = local_1c8._2_2_;
    sStack_384 = local_1c8._4_2_;
    uStack_382 = local_1c8._6_2_;
    sStack_380 = local_1c8._8_2_;
    uStack_37e = local_1c8._10_2_;
    sStack_37c = local_1c8._12_2_;
    uStack_37a = local_1c8._14_2_;
    uStack_390 = CONCAT44(uStack_1ac,uStack_1b0);
    local_398 = local_1b8;
    auVar384._4_4_ = uStack_1a4;
    auVar384._0_4_ = local_1a8;
    auVar384._8_8_ = uStack_1a0;
    local_338 = local_198;
    uStack_330 = uStack_190;
    local_288 = local_1e8;
    local_268 = local_258;
    local_298 = local_1d8;
  }
  auVar107._8_4_ = uStack_200;
  auVar107._0_8_ = CONCAT44(uStack_204,local_208);
  auVar143._4_8_ = local_1f8;
  auVar143._0_4_ = uVar165;
  auVar143._12_4_ = 0;
  auVar379._0_12_ = SUB1612(auVar143 << 0x20,0);
  auVar379._12_2_ = uVar58;
  auVar379._14_2_ = uVar59;
  auVar378._12_4_ = auVar379._12_4_;
  auVar378._0_10_ = SUB1610(auVar143 << 0x20,0);
  auVar378._10_2_ = sVar323;
  auVar144._4_2_ = auVar173._0_2_;
  auVar144._0_4_ = uVar165;
  auVar144._6_6_ = auVar378._10_6_;
  auVar123._4_8_ = auVar144._4_8_;
  auVar123._2_2_ = uVar52;
  auVar123._0_2_ = uVar51;
  auVar377._0_4_ = auVar4._0_4_;
  auVar377._4_12_ = auVar123;
  auVar283._12_2_ = (short)((uint)uStack_204 >> 0x10);
  auVar283._0_12_ = auVar107;
  auVar283._14_2_ = sStack_212;
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._0_10_ = auVar107._0_10_;
  auVar282._10_2_ = sStack_214;
  auVar281._10_6_ = auVar282._10_6_;
  auVar281._8_2_ = (short)uStack_204;
  auVar281._0_8_ = CONCAT44(uStack_204,local_208);
  auVar124._4_8_ = auVar281._8_8_;
  auVar124._2_2_ = sStack_216;
  auVar124._0_2_ = (short)((uint)local_208 >> 0x10);
  auVar4._8_8_ = uStack_220;
  auVar4._0_8_ = local_228;
  auVar321._0_12_ = auVar4._0_12_;
  auVar321._12_2_ = (short)((ulong)local_228 >> 0x30);
  auVar321._14_2_ = local_238._6_2_;
  auVar320._12_4_ = auVar321._12_4_;
  auVar320._0_10_ = auVar4._0_10_;
  auVar320._10_2_ = local_238._4_2_;
  auVar319._10_6_ = auVar320._10_6_;
  auVar319._8_2_ = (short)((ulong)local_228 >> 0x20);
  auVar319._0_8_ = local_228;
  auVar125._4_8_ = auVar319._8_8_;
  auVar125._2_2_ = local_238._2_2_;
  auVar125._0_2_ = (short)((ulong)local_228 >> 0x10);
  auVar318._0_4_ = CONCAT22(local_238._0_2_,(short)local_228);
  auVar318._4_12_ = auVar125;
  auVar353._0_12_ = local_278._0_12_;
  auVar353._12_2_ = local_278._6_2_;
  auVar353._14_2_ = local_268._6_2_;
  auVar352._12_4_ = auVar353._12_4_;
  auVar352._0_10_ = local_278._0_10_;
  auVar352._10_2_ = local_268._4_2_;
  auVar351._10_6_ = auVar352._10_6_;
  auVar351._0_8_ = local_278._0_8_;
  auVar351._8_2_ = local_278._4_2_;
  auVar126._4_8_ = auVar351._8_8_;
  auVar126._2_2_ = local_268._2_2_;
  auVar126._0_2_ = local_278._2_2_;
  auVar254._0_8_ = auVar377._0_8_;
  auVar254._8_4_ = auVar123._0_4_;
  auVar254._12_4_ = auVar124._0_4_;
  auVar357._0_8_ = auVar318._0_8_;
  auVar357._8_4_ = auVar125._0_4_;
  auVar357._12_4_ = auVar126._0_4_;
  auVar273._0_8_ = CONCAT26(uVar66,CONCAT24(uVar65,auVar174._0_4_));
  auVar273._8_2_ = auVar176._0_2_;
  auVar273._10_2_ = sVar354;
  auVar284._12_2_ = uVar72;
  auVar284._0_12_ = auVar273;
  auVar284._14_2_ = uVar73;
  uVar165 = CONCAT22(sStack_210,(short)uStack_200);
  auVar168._0_8_ = CONCAT26(uStack_20e,CONCAT24((short)((uint)uStack_200 >> 0x10),uVar165));
  auVar168._8_2_ = (short)uStack_1fc;
  auVar168._10_2_ = sStack_20c;
  auVar173._12_2_ = (short)((uint)uStack_1fc >> 0x10);
  auVar173._0_12_ = auVar168;
  auVar173._14_2_ = uStack_20a;
  uVar164 = CONCAT22(local_238._8_2_,(short)uStack_220);
  auVar201._0_8_ = CONCAT26(local_238._10_2_,CONCAT24((short)((ulong)uStack_220 >> 0x10),uVar164));
  auVar201._8_2_ = (short)((ulong)uStack_220 >> 0x20);
  auVar201._10_2_ = local_238._12_2_;
  auVar206._12_2_ = (short)((ulong)uStack_220 >> 0x30);
  auVar206._0_12_ = auVar201;
  auVar206._14_2_ = local_238._14_2_;
  uVar221 = CONCAT22(local_268._8_2_,local_278._8_2_);
  auVar223._0_8_ = CONCAT26(local_268._10_2_,CONCAT24(local_278._10_2_,uVar221));
  auVar223._8_2_ = local_278._12_2_;
  auVar223._10_2_ = local_268._12_2_;
  auVar227._12_2_ = local_278._14_2_;
  auVar227._0_12_ = auVar223;
  auVar227._14_2_ = local_268._14_2_;
  auVar293._8_4_ = (int)((ulong)auVar273._0_8_ >> 0x20);
  auVar293._0_8_ = auVar273._0_8_;
  auVar293._12_4_ = (int)((ulong)auVar168._0_8_ >> 0x20);
  auVar306._8_4_ = (int)((ulong)auVar201._0_8_ >> 0x20);
  auVar306._0_8_ = auVar201._0_8_;
  auVar306._12_4_ = (int)((ulong)auVar223._0_8_ >> 0x20);
  *(ulong *)(s + -8) = CONCAT44(CONCAT22(local_218,(short)local_208),auVar377._0_4_);
  *(ulong *)(s + -4) = CONCAT44(CONCAT22(local_268._0_2_,local_278._0_2_),auVar318._0_4_);
  *(long *)(s + (long)pitch + -8) = auVar254._8_8_;
  *(long *)(s + (long)pitch + -8 + 4) = auVar357._8_8_;
  puVar2 = s + lVar157 + -8;
  *(int *)puVar2 = auVar144._4_4_;
  *(int *)(puVar2 + 2) = auVar281._8_4_;
  *(int *)(puVar2 + 4) = auVar319._8_4_;
  *(int *)(puVar2 + 6) = auVar351._8_4_;
  *(undefined4 *)(s + lVar159 + -4) = auVar378._12_4_;
  *(undefined4 *)(s + lVar159 + -2) = auVar282._12_4_;
  *(undefined4 *)(s + lVar159) = auVar320._12_4_;
  *(undefined4 *)(s + lVar159 + 2) = auVar352._12_4_;
  *(ulong *)(s + lVar151 + -8) = CONCAT44(uVar165,auVar174._0_4_);
  *(ulong *)(s + lVar151 + -8 + 4) = CONCAT44(uVar221,uVar164);
  *(long *)(s + lVar160 + -8) = auVar293._8_8_;
  *(long *)(s + lVar160 + -8 + 4) = auVar306._8_8_;
  puVar2 = s + lVar161 + -8;
  *(int *)puVar2 = auVar273._8_4_;
  *(int *)(puVar2 + 2) = auVar168._8_4_;
  *(int *)(puVar2 + 4) = auVar201._8_4_;
  *(int *)(puVar2 + 6) = auVar223._8_4_;
  *(int *)(s + lVar153 + -4) = auVar284._12_4_;
  *(int *)(s + lVar153 + -2) = auVar173._12_4_;
  *(int *)(s + lVar153) = auVar206._12_4_;
  *(int *)(s + lVar153 + 2) = auVar227._12_4_;
  auVar177._0_12_ = local_288._0_12_;
  auVar177._12_2_ = local_288._6_2_;
  auVar177._14_2_ = local_298._6_2_;
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._0_10_ = local_288._0_10_;
  auVar176._10_2_ = local_298._4_2_;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._0_8_ = local_288._0_8_;
  auVar175._8_2_ = local_288._4_2_;
  auVar127._4_8_ = auVar175._8_8_;
  auVar127._2_2_ = local_298._2_2_;
  auVar127._0_2_ = local_288._2_2_;
  auVar174._0_4_ = CONCAT22(local_298._0_2_,local_288._0_2_);
  auVar174._4_12_ = auVar127;
  Var145 = CONCAT64(CONCAT42(CONCAT22(local_398._6_2_,uStack_382),local_398._4_2_),
                    CONCAT22(sStack_384,uStack_382));
  auVar128._4_8_ = (long)((unkuint10)Var145 >> 0x10);
  auVar128._2_2_ = local_398._2_2_;
  auVar128._0_2_ = uStack_386;
  auVar264._0_12_ = auVar384._0_12_;
  auVar264._12_2_ = auVar384._6_2_;
  auVar264._14_2_ = local_338._6_2_;
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._0_10_ = auVar384._0_10_;
  auVar263._10_2_ = local_338._4_2_;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._0_8_ = auVar384._0_8_;
  auVar262._8_2_ = auVar384._4_2_;
  auVar129._4_8_ = auVar262._8_8_;
  auVar129._2_2_ = local_338._2_2_;
  auVar129._0_2_ = auVar384._2_2_;
  auVar261._0_4_ = CONCAT22((undefined2)local_338,auVar384._0_2_);
  auVar261._4_12_ = auVar129;
  Var146 = CONCAT64(CONCAT42(CONCAT22(uVar91,uVar91),sVar193),CONCAT22(sVar193,uVar91));
  auVar130._4_8_ = (long)((unkuint10)Var146 >> 0x10);
  auVar130._2_2_ = uVar85;
  auVar130._0_2_ = uVar84;
  auVar207._0_8_ = auVar174._0_8_;
  auVar207._8_4_ = auVar127._0_4_;
  auVar207._12_4_ = auVar128._0_4_;
  auVar294._0_8_ = auVar261._0_8_;
  auVar294._8_4_ = auVar129._0_4_;
  auVar294._12_4_ = auVar130._0_4_;
  uVar165 = CONCAT22(local_298._8_2_,local_288._8_2_);
  auVar233._0_8_ = CONCAT26(local_298._10_2_,CONCAT24(local_288._10_2_,uVar165));
  auVar233._8_2_ = local_288._12_2_;
  auVar233._10_2_ = local_298._12_2_;
  auVar236._12_2_ = local_288._14_2_;
  auVar236._0_12_ = auVar233;
  auVar236._14_2_ = local_298._14_2_;
  auVar296._0_8_ =
       CONCAT26(uStack_390._2_2_,CONCAT24(uStack_37e,CONCAT22((undefined2)uStack_390,sStack_380)));
  auVar296._8_2_ = sStack_37c;
  auVar296._10_2_ = uStack_390._4_2_;
  auVar307._12_2_ = uStack_37a;
  auVar307._0_12_ = auVar296;
  auVar307._14_2_ = uStack_390._6_2_;
  uVar164 = CONCAT22((undefined2)uStack_330,auVar384._8_2_);
  auVar381._0_8_ = CONCAT26(uStack_330._2_2_,CONCAT24(auVar384._10_2_,uVar164));
  auVar381._8_2_ = auVar384._12_2_;
  auVar381._10_2_ = uStack_330._4_2_;
  auVar385._12_2_ = auVar384._14_2_;
  auVar385._0_12_ = auVar381;
  auVar385._14_2_ = uStack_330._6_2_;
  auVar312._0_8_ = CONCAT26(uVar97,CONCAT24(uVar96,auVar202._12_4_));
  auVar312._8_2_ = sVar218;
  auVar312._10_2_ = auVar203._14_2_;
  auVar322._12_2_ = uVar102;
  auVar322._0_12_ = auVar312;
  auVar322._14_2_ = uVar103;
  auVar265._8_4_ = (int)((ulong)auVar233._0_8_ >> 0x20);
  auVar265._0_8_ = auVar233._0_8_;
  auVar265._12_4_ = (int)((ulong)auVar296._0_8_ >> 0x20);
  auVar285._8_4_ = (int)((ulong)auVar381._0_8_ >> 0x20);
  auVar285._0_8_ = auVar381._0_8_;
  auVar285._12_4_ = (int)((ulong)auVar312._0_8_ >> 0x20);
  *(ulong *)s = CONCAT44(CONCAT22((short)local_398,local_388),auVar174._0_4_);
  *(ulong *)(s + 4) = CONCAT44(auVar169._12_4_,auVar261._0_4_);
  *(long *)(s + pitch) = auVar207._8_8_;
  *(long *)(s + pitch + 4) = auVar294._8_8_;
  puVar2 = s + lVar157;
  *(int *)puVar2 = auVar175._8_4_;
  *(int *)(puVar2 + 2) = (int)((unkuint10)Var145 >> 0x10);
  *(int *)(puVar2 + 4) = auVar262._8_4_;
  *(int *)(puVar2 + 6) = (int)((unkuint10)Var146 >> 0x10);
  *(undefined4 *)(s + lVar159 + 4) = auVar176._12_4_;
  *(uint *)(s + lVar159 + 6) = CONCAT22(local_398._6_2_,uStack_382);
  *(undefined4 *)(s + lVar159 + 8) = auVar263._12_4_;
  *(uint *)(s + lVar159 + 10) = CONCAT22(uVar91,uVar91);
  *(ulong *)(s + lVar151) = CONCAT44(CONCAT22((undefined2)uStack_390,sStack_380),uVar165);
  *(ulong *)(s + lVar151 + 4) = CONCAT44(auVar202._12_4_,uVar164);
  *(long *)(s + lVar160) = auVar265._8_8_;
  *(long *)(s + lVar160 + 4) = auVar285._8_8_;
  puVar2 = s + lVar161;
  *(int *)puVar2 = auVar233._8_4_;
  *(int *)(puVar2 + 2) = auVar296._8_4_;
  *(int *)(puVar2 + 4) = auVar381._8_4_;
  *(int *)(puVar2 + 6) = auVar312._8_4_;
  *(int *)(s + lVar153 + 4) = auVar236._12_4_;
  *(int *)(s + lVar153 + 6) = auVar307._12_4_;
  *(int *)(s + lVar153 + 8) = auVar385._12_4_;
  *(int *)(s + lVar153 + 10) = auVar322._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i q[7], p[7];
  __m128i p6, p5, p4, p3, p2, p1, p0, q0;
  __m128i p6_2, p5_2, p4_2, p3_2, p2_2, p1_2, q0_2, p0_2;
  __m128i d0, d7;
  __m128i d0_out, d1_out, d2_out, d3_out, d4_out, d5_out, d6_out, d7_out;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));
  p2 = _mm_loadu_si128((__m128i *)((s - 8) + 4 * pitch));
  p1 = _mm_loadu_si128((__m128i *)((s - 8) + 5 * pitch));
  p0 = _mm_loadu_si128((__m128i *)((s - 8) + 6 * pitch));
  q0 = _mm_loadu_si128((__m128i *)((s - 8) + 7 * pitch));

  highbd_transpose8x8_sse2(&p6, &p5, &p4, &p3, &p2, &p1, &p0, &q0, &d0, &p[6],
                           &p[5], &p[4], &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));
  p2_2 = _mm_loadu_si128((__m128i *)(s + 4 * pitch));
  p1_2 = _mm_loadu_si128((__m128i *)(s + 5 * pitch));
  p0_2 = _mm_loadu_si128((__m128i *)(s + 6 * pitch));
  q0_2 = _mm_loadu_si128((__m128i *)(s + 7 * pitch));

  highbd_transpose8x8_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &p2_2, &p1_2, &p0_2,
                           &q0_2, &q[0], &q[1], &q[2], &q[3], &q[4], &q[5],
                           &q[6], &d7);

  highbd_lpf_internal_14_dual_sse2(p, q, blimit0, limit0, thresh0, blimit1,
                                   limit1, thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &p[6], &p[5], &p[4], &p[3], &p[2], &p[1], &p[0],
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 7 * pitch), d7_out);

  highbd_transpose8x8_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6], &d7,
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s + 7 * pitch), d7_out);
}